

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  uint uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  Geometry *geometry;
  long lVar66;
  long lVar67;
  bool bVar68;
  ulong uVar69;
  byte bVar70;
  float fVar71;
  float fVar72;
  float fVar121;
  float fVar123;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar83 [16];
  float fVar122;
  float fVar124;
  float fVar126;
  float fVar127;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar125;
  float fVar128;
  float fVar129;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined4 uVar130;
  float fVar134;
  float fVar135;
  vint4 bi_2;
  float fVar136;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined8 uVar137;
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  vint4 bi;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  vint4 ai_2;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 ai_1;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar167;
  float fVar170;
  vint4 ai;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  undefined1 auVar196 [64];
  RTCFilterFunctionNArguments args;
  int local_524;
  RayQueryContext *local_520;
  Ray *local_518;
  ulong local_510;
  Precalculations *local_508;
  RTCFilterFunctionNArguments local_500;
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  Geometry *local_4a0;
  ulong local_498;
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  ulong local_450;
  Primitive *local_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_180 [4];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar9 = prim[1];
  uVar63 = (ulong)(byte)PVar9;
  lVar28 = uVar63 * 0x25;
  fVar167 = *(float *)(prim + lVar28 + 0x12);
  auVar80 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar146._0_4_ = fVar167 * (ray->dir).field_0.m128[0];
  auVar146._4_4_ = fVar167 * (ray->dir).field_0.m128[1];
  auVar146._8_4_ = fVar167 * (ray->dir).field_0.m128[2];
  auVar146._12_4_ = fVar167 * (ray->dir).field_0.m128[3];
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar157._0_4_ = fVar167 * auVar80._0_4_;
  auVar157._4_4_ = fVar167 * auVar80._4_4_;
  auVar157._8_4_ = fVar167 * auVar80._8_4_;
  auVar157._12_4_ = fVar167 * auVar80._12_4_;
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar9 * 0x10 + uVar63 + 6)));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar163._4_4_ = auVar146._0_4_;
  auVar163._0_4_ = auVar146._0_4_;
  auVar163._8_4_ = auVar146._0_4_;
  auVar163._12_4_ = auVar146._0_4_;
  auVar25 = vshufps_avx(auVar146,auVar146,0x55);
  auVar26 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar167 = auVar26._0_4_;
  auVar147._0_4_ = fVar167 * auVar74._0_4_;
  fVar134 = auVar26._4_4_;
  auVar147._4_4_ = fVar134 * auVar74._4_4_;
  fVar135 = auVar26._8_4_;
  auVar147._8_4_ = fVar135 * auVar74._8_4_;
  fVar136 = auVar26._12_4_;
  auVar147._12_4_ = fVar136 * auVar74._12_4_;
  auVar138._0_4_ = auVar75._0_4_ * fVar167;
  auVar138._4_4_ = auVar75._4_4_ * fVar134;
  auVar138._8_4_ = auVar75._8_4_ * fVar135;
  auVar138._12_4_ = auVar75._12_4_ * fVar136;
  auVar83._0_4_ = auVar76._0_4_ * fVar167;
  auVar83._4_4_ = auVar76._4_4_ * fVar134;
  auVar83._8_4_ = auVar76._8_4_ * fVar135;
  auVar83._12_4_ = auVar76._12_4_ * fVar136;
  auVar26 = vfmadd231ps_fma(auVar147,auVar25,auVar80);
  auVar30 = vfmadd231ps_fma(auVar138,auVar25,auVar22);
  auVar25 = vfmadd231ps_fma(auVar83,auVar24,auVar25);
  auVar26 = vfmadd231ps_fma(auVar26,auVar163,auVar81);
  auVar30 = vfmadd231ps_fma(auVar30,auVar163,auVar21);
  auVar82 = vfmadd231ps_fma(auVar25,auVar23,auVar163);
  auVar183._4_4_ = auVar157._0_4_;
  auVar183._0_4_ = auVar157._0_4_;
  auVar183._8_4_ = auVar157._0_4_;
  auVar183._12_4_ = auVar157._0_4_;
  auVar25 = vshufps_avx(auVar157,auVar157,0x55);
  auVar73 = vshufps_avx512vl(auVar157,auVar157,0xaa);
  auVar74 = vmulps_avx512vl(auVar73,auVar74);
  auVar75 = vmulps_avx512vl(auVar73,auVar75);
  auVar76 = vmulps_avx512vl(auVar73,auVar76);
  auVar80 = vfmadd231ps_fma(auVar74,auVar25,auVar80);
  auVar74 = vfmadd231ps_fma(auVar75,auVar25,auVar22);
  auVar22 = vfmadd231ps_fma(auVar76,auVar25,auVar24);
  auVar31 = vfmadd231ps_fma(auVar80,auVar183,auVar81);
  auVar83 = vfmadd231ps_fma(auVar74,auVar183,auVar21);
  auVar174._8_4_ = 0x7fffffff;
  auVar174._0_8_ = 0x7fffffff7fffffff;
  auVar174._12_4_ = 0x7fffffff;
  auVar131 = vfmadd231ps_fma(auVar22,auVar183,auVar23);
  auVar81 = vandps_avx(auVar174,auVar26);
  auVar171._8_4_ = 0x219392ef;
  auVar171._0_8_ = 0x219392ef219392ef;
  auVar171._12_4_ = 0x219392ef;
  uVar69 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar68 = (bool)((byte)uVar69 & 1);
  auVar77._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar26._0_4_;
  bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar26._4_4_;
  bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar26._8_4_;
  bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar26._12_4_;
  auVar81 = vandps_avx(auVar174,auVar30);
  uVar69 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar68 = (bool)((byte)uVar69 & 1);
  auVar78._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar30._0_4_;
  bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar78._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar30._4_4_;
  bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar78._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar30._8_4_;
  bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar78._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar30._12_4_;
  auVar81 = vandps_avx(auVar174,auVar82);
  uVar69 = vcmpps_avx512vl(auVar81,auVar171,1);
  bVar68 = (bool)((byte)uVar69 & 1);
  auVar79._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar82._0_4_;
  bVar68 = (bool)((byte)(uVar69 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar82._4_4_;
  bVar68 = (bool)((byte)(uVar69 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar82._8_4_;
  bVar68 = (bool)((byte)(uVar69 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar82._12_4_;
  auVar80 = vrcp14ps_avx512vl(auVar77);
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = 0x3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar77,auVar80,auVar172);
  auVar82 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar78);
  auVar81 = vfnmadd213ps_fma(auVar78,auVar80,auVar172);
  auVar73 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  auVar80 = vrcp14ps_avx512vl(auVar79);
  auVar81 = vfnmadd213ps_fma(auVar79,auVar80,auVar172);
  auVar29 = vfmadd132ps_fma(auVar81,auVar80,auVar80);
  fVar167 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar168._4_4_ = fVar167;
  auVar168._0_4_ = fVar167;
  auVar168._8_4_ = fVar167;
  auVar168._12_4_ = fVar167;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar81 = vpmovsxwd_avx(auVar81);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar80 = vpmovsxwd_avx(auVar80);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar21 = vsubps_avx(auVar80,auVar81);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar80 = vpmovsxwd_avx(auVar74);
  auVar74 = vfmadd213ps_fma(auVar21,auVar168,auVar81);
  auVar81 = vcvtdq2ps_avx(auVar80);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar80 = vpmovsxwd_avx(auVar21);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar21 = vfmadd213ps_fma(auVar80,auVar168,auVar81);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar81 = vpmovsxwd_avx(auVar22);
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar69 = (ulong)(uint)((int)(uVar63 * 5) << 2);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 2 + uVar69 + 6);
  auVar80 = vpmovsxwd_avx(auVar75);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar22 = vfmadd213ps_fma(auVar80,auVar168,auVar81);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar81 = vpmovsxwd_avx(auVar23);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar80 = vpmovsxwd_avx(auVar24);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar75 = vfmadd213ps_fma(auVar80,auVar168,auVar81);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar81 = vpmovsxwd_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar63 + (ulong)(byte)PVar9 * 0x20 + 6);
  auVar80 = vpmovsxwd_avx(auVar25);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar23 = vfmadd213ps_fma(auVar80,auVar168,auVar81);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar9 * 0x20 - uVar63) + 6);
  auVar81 = vpmovsxwd_avx(auVar26);
  auVar81 = vcvtdq2ps_avx(auVar81);
  local_448 = prim;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar80 = vpmovsxwd_avx(auVar30);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar80 = vsubps_avx(auVar80,auVar81);
  auVar80 = vfmadd213ps_fma(auVar80,auVar168,auVar81);
  auVar81 = vsubps_avx(auVar74,auVar31);
  auVar169._0_4_ = auVar82._0_4_ * auVar81._0_4_;
  auVar169._4_4_ = auVar82._4_4_ * auVar81._4_4_;
  auVar169._8_4_ = auVar82._8_4_ * auVar81._8_4_;
  auVar169._12_4_ = auVar82._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar21,auVar31);
  auVar148._0_4_ = auVar82._0_4_ * auVar81._0_4_;
  auVar148._4_4_ = auVar82._4_4_ * auVar81._4_4_;
  auVar148._8_4_ = auVar82._8_4_ * auVar81._8_4_;
  auVar148._12_4_ = auVar82._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar22,auVar83);
  auVar164._0_4_ = auVar73._0_4_ * auVar81._0_4_;
  auVar164._4_4_ = auVar73._4_4_ * auVar81._4_4_;
  auVar164._8_4_ = auVar73._8_4_ * auVar81._8_4_;
  auVar164._12_4_ = auVar73._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar75,auVar83);
  auVar139._0_4_ = auVar73._0_4_ * auVar81._0_4_;
  auVar139._4_4_ = auVar73._4_4_ * auVar81._4_4_;
  auVar139._8_4_ = auVar73._8_4_ * auVar81._8_4_;
  auVar139._12_4_ = auVar73._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar23,auVar131);
  auVar158._0_4_ = auVar29._0_4_ * auVar81._0_4_;
  auVar158._4_4_ = auVar29._4_4_ * auVar81._4_4_;
  auVar158._8_4_ = auVar29._8_4_ * auVar81._8_4_;
  auVar158._12_4_ = auVar29._12_4_ * auVar81._12_4_;
  auVar81 = vsubps_avx(auVar80,auVar131);
  auVar131._0_4_ = auVar29._0_4_ * auVar81._0_4_;
  auVar131._4_4_ = auVar29._4_4_ * auVar81._4_4_;
  auVar131._8_4_ = auVar29._8_4_ * auVar81._8_4_;
  auVar131._12_4_ = auVar29._12_4_ * auVar81._12_4_;
  auVar81 = vpminsd_avx(auVar169,auVar148);
  auVar80 = vpminsd_avx(auVar164,auVar139);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar80 = vpminsd_avx(auVar158,auVar131);
  uVar130 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar82._4_4_ = uVar130;
  auVar82._0_4_ = uVar130;
  auVar82._8_4_ = uVar130;
  auVar82._12_4_ = uVar130;
  auVar80 = vmaxps_avx512vl(auVar80,auVar82);
  auVar81 = vmaxps_avx(auVar81,auVar80);
  auVar73._8_4_ = 0x3f7ffffa;
  auVar73._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar73._12_4_ = 0x3f7ffffa;
  local_250 = vmulps_avx512vl(auVar81,auVar73);
  auVar81 = vpmaxsd_avx(auVar169,auVar148);
  auVar80 = vpmaxsd_avx(auVar164,auVar139);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar80 = vpmaxsd_avx(auVar158,auVar131);
  fVar167 = ray->tfar;
  auVar29._4_4_ = fVar167;
  auVar29._0_4_ = fVar167;
  auVar29._8_4_ = fVar167;
  auVar29._12_4_ = fVar167;
  auVar80 = vminps_avx512vl(auVar80,auVar29);
  auVar81 = vminps_avx(auVar81,auVar80);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar31);
  local_508 = pre;
  auVar80 = vpbroadcastd_avx512vl();
  uVar137 = vcmpps_avx512vl(local_250,auVar81,2);
  uVar69 = vpcmpgtd_avx512vl(auVar80,_DAT_01f7fcf0);
  uVar69 = ((byte)uVar137 & 0xf) & uVar69;
  if ((char)uVar69 == '\0') {
    bVar68 = false;
  }
  else {
    local_518 = ray;
    local_520 = context;
    do {
      lVar28 = 0;
      for (uVar63 = uVar69; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      local_510 = (ulong)*(uint *)(local_448 + 2);
      pGVar11 = (context->scene->geometries).items[*(uint *)(local_448 + 2)].ptr;
      local_498 = (ulong)*(uint *)(local_448 + lVar28 * 4 + 6);
      uVar63 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                               (ulong)*(uint *)(local_448 + lVar28 * 4 + 6) *
                               pGVar11[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar167 = (pGVar11->time_range).lower;
      fVar167 = pGVar11->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar167) / ((pGVar11->time_range).upper - fVar167));
      auVar81 = vroundss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),9);
      auVar81 = vminss_avx(auVar81,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar81 = vmaxss_avx(ZEXT816(0) << 0x20,auVar81);
      fVar167 = fVar167 - auVar81._0_4_;
      _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar67 = (long)(int)auVar81._0_4_ * 0x38;
      lVar28 = *(long *)(_Var12 + 0x10 + lVar67);
      lVar66 = *(long *)(_Var12 + 0x38 + lVar67);
      lVar13 = *(long *)(_Var12 + 0x48 + lVar67);
      auVar140._4_4_ = fVar167;
      auVar140._0_4_ = fVar167;
      auVar140._8_4_ = fVar167;
      auVar140._12_4_ = fVar167;
      pfVar3 = (float *)(lVar66 + uVar63 * lVar13);
      auVar175._0_4_ = fVar167 * *pfVar3;
      auVar175._4_4_ = fVar167 * pfVar3[1];
      auVar175._8_4_ = fVar167 * pfVar3[2];
      auVar175._12_4_ = fVar167 * pfVar3[3];
      pfVar3 = (float *)(lVar66 + (uVar63 + 1) * lVar13);
      auVar179._0_4_ = fVar167 * *pfVar3;
      auVar179._4_4_ = fVar167 * pfVar3[1];
      auVar179._8_4_ = fVar167 * pfVar3[2];
      auVar179._12_4_ = fVar167 * pfVar3[3];
      auVar81 = vmulps_avx512vl(auVar140,*(undefined1 (*) [16])(lVar66 + (uVar63 + 2) * lVar13));
      auVar80 = vmulps_avx512vl(auVar140,*(undefined1 (*) [16])(lVar66 + lVar13 * (uVar63 + 3)));
      lVar66 = *(long *)(_Var12 + lVar67);
      fVar167 = 1.0 - fVar167;
      auVar132._4_4_ = fVar167;
      auVar132._0_4_ = fVar167;
      auVar132._8_4_ = fVar167;
      auVar132._12_4_ = fVar167;
      local_460 = vfmadd231ps_fma(auVar175,auVar132,*(undefined1 (*) [16])(lVar66 + lVar28 * uVar63)
                                 );
      local_470 = vfmadd231ps_fma(auVar179,auVar132,
                                  *(undefined1 (*) [16])(lVar66 + lVar28 * (uVar63 + 1)));
      local_480 = vfmadd231ps_avx512vl
                            (auVar81,auVar132,*(undefined1 (*) [16])(lVar66 + lVar28 * (uVar63 + 2))
                            );
      _local_310 = vfmadd231ps_avx512vl
                             (auVar80,auVar132,
                              *(undefined1 (*) [16])(lVar66 + lVar28 * (uVar63 + 3)));
      iVar10 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar28 = (long)iVar10 * 0x44;
      aVar4 = (local_518->org).field_0;
      auVar80 = vsubps_avx(local_460,(undefined1  [16])aVar4);
      uVar130 = auVar80._0_4_;
      auVar141._4_4_ = uVar130;
      auVar141._0_4_ = uVar130;
      auVar141._8_4_ = uVar130;
      auVar141._12_4_ = uVar130;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      aVar5 = (local_508->ray_space).vx.field_0;
      aVar6 = (local_508->ray_space).vy.field_0;
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      fVar167 = (local_508->ray_space).vz.field_0.m128[0];
      fVar134 = (local_508->ray_space).vz.field_0.m128[1];
      fVar135 = (local_508->ray_space).vz.field_0.m128[2];
      fVar136 = (local_508->ray_space).vz.field_0.m128[3];
      auVar177._0_4_ = auVar80._0_4_ * fVar167;
      auVar177._4_4_ = auVar80._4_4_ * fVar134;
      auVar177._8_4_ = auVar80._8_4_ * fVar135;
      auVar177._12_4_ = auVar80._12_4_ * fVar136;
      auVar81 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar6,auVar81);
      auVar74 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar5,auVar141);
      auVar80 = vsubps_avx(local_470,(undefined1  [16])aVar4);
      uVar130 = auVar80._0_4_;
      auVar142._4_4_ = uVar130;
      auVar142._0_4_ = uVar130;
      auVar142._8_4_ = uVar130;
      auVar142._12_4_ = uVar130;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar180._0_4_ = auVar80._0_4_ * fVar167;
      auVar180._4_4_ = auVar80._4_4_ * fVar134;
      auVar180._8_4_ = auVar80._8_4_ * fVar135;
      auVar180._12_4_ = auVar80._12_4_ * fVar136;
      auVar81 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar6,auVar81);
      auVar21 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar5,auVar142);
      auVar80 = vsubps_avx512vl(local_480,(undefined1  [16])aVar4);
      uVar130 = auVar80._0_4_;
      auVar143._4_4_ = uVar130;
      auVar143._0_4_ = uVar130;
      auVar143._8_4_ = uVar130;
      auVar143._12_4_ = uVar130;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar181._0_4_ = auVar80._0_4_ * fVar167;
      auVar181._4_4_ = auVar80._4_4_ * fVar134;
      auVar181._8_4_ = auVar80._8_4_ * fVar135;
      auVar181._12_4_ = auVar80._12_4_ * fVar136;
      auVar81 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar81);
      auVar22 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar5,auVar143);
      local_2a0 = ZEXT1632((undefined1  [16])aVar4);
      auVar80 = vsubps_avx512vl(_local_310,(undefined1  [16])aVar4);
      uVar130 = auVar80._0_4_;
      auVar144._4_4_ = uVar130;
      auVar144._0_4_ = uVar130;
      auVar144._8_4_ = uVar130;
      auVar144._12_4_ = uVar130;
      auVar81 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar184._0_4_ = auVar80._0_4_ * fVar167;
      auVar184._4_4_ = auVar80._4_4_ * fVar134;
      auVar184._8_4_ = auVar80._8_4_ * fVar135;
      auVar184._12_4_ = auVar80._12_4_ * fVar136;
      auVar81 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar6,auVar81);
      auVar75 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar5,auVar144);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      uVar130 = auVar74._0_4_;
      local_3c0._4_4_ = uVar130;
      local_3c0._0_4_ = uVar130;
      local_3c0._8_4_ = uVar130;
      local_3c0._12_4_ = uVar130;
      local_3c0._16_4_ = uVar130;
      local_3c0._20_4_ = uVar130;
      local_3c0._24_4_ = uVar130;
      local_3c0._28_4_ = uVar130;
      auVar84._8_4_ = 1;
      auVar84._0_8_ = 0x100000001;
      auVar84._12_4_ = 1;
      auVar84._16_4_ = 1;
      auVar84._20_4_ = 1;
      auVar84._24_4_ = 1;
      auVar84._28_4_ = 1;
      local_340 = vpermps_avx2(auVar84,ZEXT1632(auVar74));
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      uVar130 = auVar21._0_4_;
      local_3e0._4_4_ = uVar130;
      local_3e0._0_4_ = uVar130;
      local_3e0._8_4_ = uVar130;
      local_3e0._12_4_ = uVar130;
      local_3e0._16_4_ = uVar130;
      local_3e0._20_4_ = uVar130;
      local_3e0._24_4_ = uVar130;
      local_3e0._28_4_ = uVar130;
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      local_360 = vpermps_avx512vl(auVar84,ZEXT1632(auVar21));
      local_400 = vbroadcastss_avx512vl(auVar22);
      local_420 = vpermps_avx512vl(auVar84,ZEXT1632(auVar22));
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      uVar130 = auVar75._0_4_;
      local_380._4_4_ = uVar130;
      local_380._0_4_ = uVar130;
      local_380._8_4_ = uVar130;
      local_380._12_4_ = uVar130;
      local_380._16_4_ = uVar130;
      local_380._20_4_ = uVar130;
      local_380._24_4_ = uVar130;
      local_380._28_4_ = uVar130;
      local_3a0 = vpermps_avx512vl(auVar84,ZEXT1632(auVar75));
      auVar84 = vmulps_avx512vl(local_380,auVar96);
      auVar85 = vmulps_avx512vl(local_3a0,auVar96);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,local_400);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,local_420);
      auVar81 = vfmadd231ps_fma(auVar84,auVar100,local_3e0);
      auVar86 = vfmadd231ps_avx512vl(auVar85,auVar100,local_360);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar98,local_3c0);
      auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar88 = vfmadd231ps_avx512vl(auVar86,auVar98,local_340);
      auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar89 = vmulps_avx512vl(local_380,auVar95);
      auVar90 = vmulps_avx512vl(local_3a0,auVar95);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_400);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_420);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,local_3e0);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,local_360);
      auVar23 = vfmadd231ps_fma(auVar89,auVar84,local_3c0);
      auVar24 = vfmadd231ps_fma(auVar90,auVar84,local_340);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar23),auVar87);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar24),auVar88);
      auVar91 = vmulps_avx512vl(auVar88,auVar89);
      auVar92 = vmulps_avx512vl(auVar87,auVar90);
      auVar91 = vsubps_avx512vl(auVar91,auVar92);
      auVar81 = vshufps_avx(local_460,local_460,0xff);
      uVar137 = auVar81._0_8_;
      local_80._8_8_ = uVar137;
      local_80._0_8_ = uVar137;
      local_80._16_8_ = uVar137;
      local_80._24_8_ = uVar137;
      auVar81 = vshufps_avx(local_470,local_470,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar81);
      auVar81 = vshufps_avx512vl(local_480,local_480,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar81);
      auVar81 = vshufps_avx512vl(_local_310,_local_310,0xff);
      uVar137 = auVar81._0_8_;
      register0x000012c8 = uVar137;
      local_e0 = uVar137;
      register0x000012d0 = uVar137;
      register0x000012d8 = uVar137;
      auVar92 = vmulps_avx512vl(_local_e0,auVar96);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_c0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_a0);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_80);
      auVar93 = vmulps_avx512vl(_local_e0,auVar95);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar85,local_a0);
      auVar76 = vfmadd231ps_fma(auVar93,auVar84,local_80);
      auVar93 = vmulps_avx512vl(auVar90,auVar90);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar89);
      auVar94 = vmaxps_avx512vl(auVar92,ZEXT1632(auVar76));
      auVar94 = vmulps_avx512vl(auVar94,auVar94);
      auVar93 = vmulps_avx512vl(auVar94,auVar93);
      auVar91 = vmulps_avx512vl(auVar91,auVar91);
      uVar137 = vcmpps_avx512vl(auVar91,auVar93,2);
      auVar30 = local_460;
      auVar81 = vblendps_avx(auVar74,local_460,8);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar80 = vandps_avx512vl(auVar81,auVar82);
      auVar26 = local_470;
      auVar81 = vblendps_avx(auVar21,local_470,8);
      auVar81 = vandps_avx512vl(auVar81,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar81);
      auVar25 = local_480;
      auVar81 = vblendps_avx(auVar22,local_480,8);
      auVar73 = vandps_avx512vl(auVar81,auVar82);
      auVar81 = vblendps_avx(auVar75,_local_310,8);
      auVar81 = vandps_avx512vl(auVar81,auVar82);
      auVar81 = vmaxps_avx(auVar73,auVar81);
      auVar81 = vmaxps_avx(auVar80,auVar81);
      auVar80 = vmovshdup_avx(auVar81);
      auVar80 = vmaxss_avx(auVar80,auVar81);
      auVar81 = vshufpd_avx(auVar81,auVar81,1);
      auVar81 = vmaxss_avx(auVar81,auVar80);
      _local_2c0 = vcvtsi2ss_avx512f(_local_310,iVar10);
      auVar93._0_4_ = local_2c0._0_4_;
      auVar93._4_4_ = auVar93._0_4_;
      auVar93._8_4_ = auVar93._0_4_;
      auVar93._12_4_ = auVar93._0_4_;
      auVar93._16_4_ = auVar93._0_4_;
      auVar93._20_4_ = auVar93._0_4_;
      auVar93._24_4_ = auVar93._0_4_;
      auVar93._28_4_ = auVar93._0_4_;
      uVar27 = vcmpps_avx512vl(auVar93,_DAT_01faff40,0xe);
      bVar70 = (byte)uVar137 & (byte)uVar27;
      auVar81 = vmulss_avx512f(auVar81,ZEXT416(0x35000000));
      auVar91._8_4_ = 2;
      auVar91._0_8_ = 0x200000002;
      auVar91._12_4_ = 2;
      auVar91._16_4_ = 2;
      auVar91._20_4_ = 2;
      auVar91._24_4_ = 2;
      auVar91._28_4_ = 2;
      local_2e0 = vpermps_avx2(auVar91,ZEXT1632(auVar74));
      local_100 = vpermps_avx512vl(auVar91,ZEXT1632(auVar21));
      local_120 = vpermps_avx512vl(auVar91,ZEXT1632(auVar22));
      local_440 = vpermps_avx2(auVar91,ZEXT1632(auVar75));
      auVar80 = local_100._0_16_;
      if (bVar70 == 0) {
        bVar68 = false;
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar188 = ZEXT3264(auVar98);
        auVar80 = vxorps_avx512vl(auVar80,auVar80);
        auVar189 = ZEXT1664(auVar80);
        auVar187 = ZEXT3264(local_3c0);
        auVar190 = ZEXT3264(local_340);
        auVar196 = ZEXT3264(local_3e0);
        auVar192 = ZEXT3264(local_360);
        auVar194 = ZEXT3264(local_400);
        auVar193 = ZEXT3264(local_420);
        auVar191 = ZEXT3264(local_380);
        auVar195 = ZEXT3264(local_3a0);
        local_480 = auVar25;
        local_470 = auVar26;
        local_460 = auVar30;
      }
      else {
        auVar95 = vmulps_avx512vl(local_440,auVar95);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar95);
        auVar85 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
        auVar91 = vfmadd213ps_avx512vl(auVar84,local_2e0,auVar85);
        auVar96 = vmulps_avx512vl(local_440,auVar96);
        auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar96);
        auVar85 = vfmadd213ps_avx512vl(auVar100,local_100,auVar97);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar84 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar94 = vfmadd213ps_avx512vl(auVar98,local_2e0,auVar85);
        auVar98 = vmulps_avx512vl(local_380,auVar84);
        auVar195 = ZEXT3264(local_3a0);
        auVar85 = vmulps_avx512vl(local_3a0,auVar84);
        auVar182._0_4_ = local_440._0_4_ * auVar84._0_4_;
        auVar182._4_4_ = local_440._4_4_ * auVar84._4_4_;
        auVar182._8_4_ = local_440._8_4_ * auVar84._8_4_;
        auVar182._12_4_ = local_440._12_4_ * auVar84._12_4_;
        auVar182._16_4_ = local_440._16_4_ * auVar84._16_4_;
        auVar182._20_4_ = local_440._20_4_ * auVar84._20_4_;
        auVar182._24_4_ = local_440._24_4_ * auVar84._24_4_;
        auVar182._28_4_ = 0;
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar96,local_400);
        auVar193 = ZEXT3264(local_420);
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar96,local_420);
        auVar96 = vfmadd231ps_avx512vl(auVar182,local_120,auVar96);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar97,local_3e0);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar97,local_360);
        auVar85 = vfmadd231ps_avx512vl(auVar96,local_100,auVar97);
        auVar187 = ZEXT3264(local_3c0);
        auVar86 = vfmadd231ps_avx512vl(auVar98,auVar100,local_3c0);
        auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,local_340);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar85 = vfmadd231ps_avx512vl(auVar85,local_2e0,auVar100);
        auVar95 = vmulps_avx512vl(local_380,auVar96);
        auVar99 = vmulps_avx512vl(local_3a0,auVar96);
        auVar100._4_4_ = local_440._4_4_ * auVar96._4_4_;
        auVar100._0_4_ = local_440._0_4_ * auVar96._0_4_;
        auVar100._8_4_ = local_440._8_4_ * auVar96._8_4_;
        auVar100._12_4_ = local_440._12_4_ * auVar96._12_4_;
        auVar100._16_4_ = local_440._16_4_ * auVar96._16_4_;
        auVar100._20_4_ = local_440._20_4_ * auVar96._20_4_;
        auVar100._24_4_ = local_440._24_4_ * auVar96._24_4_;
        auVar100._28_4_ = auVar96._28_4_;
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar97,local_400);
        auVar95 = vfmadd231ps_avx512vl(auVar99,auVar97,local_420);
        auVar97 = vfmadd231ps_avx512vl(auVar100,local_120,auVar97);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_3e0);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar100,local_360);
        auVar100 = vfmadd231ps_avx512vl(auVar97,local_100,auVar100);
        auVar97 = vfmadd231ps_avx512vl(auVar96,auVar98,local_3c0);
        auVar96 = vfmadd231ps_avx512vl(auVar95,auVar98,local_340);
        auVar95 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar98);
        auVar185._8_4_ = 0x7fffffff;
        auVar185._0_8_ = 0x7fffffff7fffffff;
        auVar185._12_4_ = 0x7fffffff;
        auVar185._16_4_ = 0x7fffffff;
        auVar185._20_4_ = 0x7fffffff;
        auVar185._24_4_ = 0x7fffffff;
        auVar185._28_4_ = 0x7fffffff;
        auVar98 = vandps_avx(auVar86,auVar185);
        auVar100 = vandps_avx(auVar84,auVar185);
        auVar100 = vmaxps_avx(auVar98,auVar100);
        auVar98 = vandps_avx(auVar85,auVar185);
        auVar98 = vmaxps_avx(auVar100,auVar98);
        auVar85 = vbroadcastss_avx512vl(auVar81);
        uVar63 = vcmpps_avx512vl(auVar98,auVar85,1);
        bVar68 = (bool)((byte)uVar63 & 1);
        auVar99._0_4_ = (float)((uint)bVar68 * auVar89._0_4_ | (uint)!bVar68 * auVar86._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar68 * auVar89._4_4_ | (uint)!bVar68 * auVar86._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar68 * auVar89._8_4_ | (uint)!bVar68 * auVar86._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar68 * auVar89._12_4_ | (uint)!bVar68 * auVar86._12_4_);
        bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar99._16_4_ = (float)((uint)bVar68 * auVar89._16_4_ | (uint)!bVar68 * auVar86._16_4_);
        bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar99._20_4_ = (float)((uint)bVar68 * auVar89._20_4_ | (uint)!bVar68 * auVar86._20_4_);
        bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar99._24_4_ = (float)((uint)bVar68 * auVar89._24_4_ | (uint)!bVar68 * auVar86._24_4_);
        bVar68 = SUB81(uVar63 >> 7,0);
        auVar99._28_4_ = (uint)bVar68 * auVar89._28_4_ | (uint)!bVar68 * auVar86._28_4_;
        bVar68 = (bool)((byte)uVar63 & 1);
        auVar101._0_4_ = (float)((uint)bVar68 * auVar90._0_4_ | (uint)!bVar68 * auVar84._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar68 * auVar90._4_4_ | (uint)!bVar68 * auVar84._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar68 * auVar90._8_4_ | (uint)!bVar68 * auVar84._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar68 * auVar90._12_4_ | (uint)!bVar68 * auVar84._12_4_);
        bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar68 * auVar90._16_4_ | (uint)!bVar68 * auVar84._16_4_);
        bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar68 * auVar90._20_4_ | (uint)!bVar68 * auVar84._20_4_);
        bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar68 * auVar90._24_4_ | (uint)!bVar68 * auVar84._24_4_);
        bVar68 = SUB81(uVar63 >> 7,0);
        auVar101._28_4_ = (uint)bVar68 * auVar90._28_4_ | (uint)!bVar68 * auVar84._28_4_;
        auVar98 = vandps_avx(auVar185,auVar97);
        auVar100 = vandps_avx(auVar96,auVar185);
        auVar100 = vmaxps_avx(auVar98,auVar100);
        auVar98 = vandps_avx(auVar95,auVar185);
        auVar98 = vmaxps_avx(auVar100,auVar98);
        uVar63 = vcmpps_avx512vl(auVar98,auVar85,1);
        bVar68 = (bool)((byte)uVar63 & 1);
        auVar102._0_4_ = (float)((uint)bVar68 * auVar89._0_4_ | (uint)!bVar68 * auVar97._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar68 * auVar89._4_4_ | (uint)!bVar68 * auVar97._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar68 * auVar89._8_4_ | (uint)!bVar68 * auVar97._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar68 * auVar89._12_4_ | (uint)!bVar68 * auVar97._12_4_);
        bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar68 * auVar89._16_4_ | (uint)!bVar68 * auVar97._16_4_);
        bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar68 * auVar89._20_4_ | (uint)!bVar68 * auVar97._20_4_);
        bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar68 * auVar89._24_4_ | (uint)!bVar68 * auVar97._24_4_);
        bVar68 = SUB81(uVar63 >> 7,0);
        auVar102._28_4_ = (uint)bVar68 * auVar89._28_4_ | (uint)!bVar68 * auVar97._28_4_;
        bVar68 = (bool)((byte)uVar63 & 1);
        auVar103._0_4_ = (float)((uint)bVar68 * auVar90._0_4_ | (uint)!bVar68 * auVar96._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar68 * auVar90._4_4_ | (uint)!bVar68 * auVar96._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar68 * auVar90._8_4_ | (uint)!bVar68 * auVar96._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar68 * auVar90._12_4_ | (uint)!bVar68 * auVar96._12_4_);
        bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar68 * auVar90._16_4_ | (uint)!bVar68 * auVar96._16_4_);
        bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar68 * auVar90._20_4_ | (uint)!bVar68 * auVar96._20_4_);
        bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar68 * auVar90._24_4_ | (uint)!bVar68 * auVar96._24_4_);
        bVar68 = SUB81(uVar63 >> 7,0);
        auVar103._28_4_ = (uint)bVar68 * auVar90._28_4_ | (uint)!bVar68 * auVar96._28_4_;
        auVar83 = vxorps_avx512vl(auVar80,auVar80);
        auVar189 = ZEXT1664(auVar83);
        auVar98 = vfmadd213ps_avx512vl(auVar99,auVar99,ZEXT1632(auVar83));
        auVar80 = vfmadd231ps_fma(auVar98,auVar101,auVar101);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar167 = auVar100._0_4_;
        fVar134 = auVar100._4_4_;
        fVar135 = auVar100._8_4_;
        fVar136 = auVar100._12_4_;
        fVar176 = auVar100._16_4_;
        fVar170 = auVar100._20_4_;
        fVar71 = auVar100._24_4_;
        auVar98._4_4_ = fVar134 * fVar134 * fVar134 * auVar80._4_4_ * -0.5;
        auVar98._0_4_ = fVar167 * fVar167 * fVar167 * auVar80._0_4_ * -0.5;
        auVar98._8_4_ = fVar135 * fVar135 * fVar135 * auVar80._8_4_ * -0.5;
        auVar98._12_4_ = fVar136 * fVar136 * fVar136 * auVar80._12_4_ * -0.5;
        auVar98._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar98._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar98._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar98._28_4_ = auVar95._28_4_;
        auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar84,auVar100);
        auVar97._4_4_ = auVar101._4_4_ * auVar98._4_4_;
        auVar97._0_4_ = auVar101._0_4_ * auVar98._0_4_;
        auVar97._8_4_ = auVar101._8_4_ * auVar98._8_4_;
        auVar97._12_4_ = auVar101._12_4_ * auVar98._12_4_;
        auVar97._16_4_ = auVar101._16_4_ * auVar98._16_4_;
        auVar97._20_4_ = auVar101._20_4_ * auVar98._20_4_;
        auVar97._24_4_ = auVar101._24_4_ * auVar98._24_4_;
        auVar97._28_4_ = 0;
        auVar96._4_4_ = auVar98._4_4_ * -auVar99._4_4_;
        auVar96._0_4_ = auVar98._0_4_ * -auVar99._0_4_;
        auVar96._8_4_ = auVar98._8_4_ * -auVar99._8_4_;
        auVar96._12_4_ = auVar98._12_4_ * -auVar99._12_4_;
        auVar96._16_4_ = auVar98._16_4_ * -auVar99._16_4_;
        auVar96._20_4_ = auVar98._20_4_ * -auVar99._20_4_;
        auVar96._24_4_ = auVar98._24_4_ * -auVar99._24_4_;
        auVar96._28_4_ = auVar100._28_4_;
        auVar98 = vmulps_avx512vl(auVar98,ZEXT1632(auVar83));
        auVar89 = ZEXT1632(auVar83);
        auVar100 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar89);
        auVar80 = vfmadd231ps_fma(auVar100,auVar103,auVar103);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar80));
        fVar167 = auVar100._0_4_;
        fVar134 = auVar100._4_4_;
        fVar135 = auVar100._8_4_;
        fVar136 = auVar100._12_4_;
        fVar176 = auVar100._16_4_;
        fVar170 = auVar100._20_4_;
        fVar71 = auVar100._24_4_;
        auVar85._4_4_ = fVar134 * fVar134 * fVar134 * auVar80._4_4_ * -0.5;
        auVar85._0_4_ = fVar167 * fVar167 * fVar167 * auVar80._0_4_ * -0.5;
        auVar85._8_4_ = fVar135 * fVar135 * fVar135 * auVar80._8_4_ * -0.5;
        auVar85._12_4_ = fVar136 * fVar136 * fVar136 * auVar80._12_4_ * -0.5;
        auVar85._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
        auVar85._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
        auVar85._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
        auVar85._28_4_ = 0;
        auVar84 = vfmadd231ps_avx512vl(auVar85,auVar84,auVar100);
        auVar86._4_4_ = auVar103._4_4_ * auVar84._4_4_;
        auVar86._0_4_ = auVar103._0_4_ * auVar84._0_4_;
        auVar86._8_4_ = auVar103._8_4_ * auVar84._8_4_;
        auVar86._12_4_ = auVar103._12_4_ * auVar84._12_4_;
        auVar86._16_4_ = auVar103._16_4_ * auVar84._16_4_;
        auVar86._20_4_ = auVar103._20_4_ * auVar84._20_4_;
        auVar86._24_4_ = auVar103._24_4_ * auVar84._24_4_;
        auVar86._28_4_ = auVar100._28_4_;
        auVar95._4_4_ = -auVar102._4_4_ * auVar84._4_4_;
        auVar95._0_4_ = -auVar102._0_4_ * auVar84._0_4_;
        auVar95._8_4_ = -auVar102._8_4_ * auVar84._8_4_;
        auVar95._12_4_ = -auVar102._12_4_ * auVar84._12_4_;
        auVar95._16_4_ = -auVar102._16_4_ * auVar84._16_4_;
        auVar95._20_4_ = -auVar102._20_4_ * auVar84._20_4_;
        auVar95._24_4_ = -auVar102._24_4_ * auVar84._24_4_;
        auVar95._28_4_ = auVar101._28_4_;
        auVar100 = vmulps_avx512vl(auVar84,auVar89);
        auVar80 = vfmadd213ps_fma(auVar97,auVar92,auVar87);
        auVar74 = vfmadd213ps_fma(auVar96,auVar92,auVar88);
        auVar84 = vfmadd213ps_avx512vl(auVar98,auVar92,auVar94);
        auVar85 = vfmadd213ps_avx512vl(auVar86,ZEXT1632(auVar76),ZEXT1632(auVar23));
        auVar82 = vfnmadd213ps_fma(auVar97,auVar92,auVar87);
        auVar87 = ZEXT1632(auVar76);
        auVar21 = vfmadd213ps_fma(auVar95,auVar87,ZEXT1632(auVar24));
        auVar73 = vfnmadd213ps_fma(auVar96,auVar92,auVar88);
        auVar22 = vfmadd213ps_fma(auVar100,auVar87,auVar91);
        auVar97 = vfnmadd231ps_avx512vl(auVar94,auVar92,auVar98);
        auVar29 = vfnmadd213ps_fma(auVar86,auVar87,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar95,auVar87,ZEXT1632(auVar24));
        auVar31 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar76),auVar100);
        auVar100 = vsubps_avx512vl(auVar85,ZEXT1632(auVar82));
        auVar98 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar73));
        auVar96 = vsubps_avx512vl(ZEXT1632(auVar22),auVar97);
        auVar86 = vmulps_avx512vl(auVar98,auVar97);
        auVar75 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar73),auVar96);
        auVar87._4_4_ = auVar82._4_4_ * auVar96._4_4_;
        auVar87._0_4_ = auVar82._0_4_ * auVar96._0_4_;
        auVar87._8_4_ = auVar82._8_4_ * auVar96._8_4_;
        auVar87._12_4_ = auVar82._12_4_ * auVar96._12_4_;
        auVar87._16_4_ = auVar96._16_4_ * 0.0;
        auVar87._20_4_ = auVar96._20_4_ * 0.0;
        auVar87._24_4_ = auVar96._24_4_ * 0.0;
        auVar87._28_4_ = auVar96._28_4_;
        auVar96 = vfmsub231ps_avx512vl(auVar87,auVar97,auVar100);
        auVar88._4_4_ = auVar73._4_4_ * auVar100._4_4_;
        auVar88._0_4_ = auVar73._0_4_ * auVar100._0_4_;
        auVar88._8_4_ = auVar73._8_4_ * auVar100._8_4_;
        auVar88._12_4_ = auVar73._12_4_ * auVar100._12_4_;
        auVar88._16_4_ = auVar100._16_4_ * 0.0;
        auVar88._20_4_ = auVar100._20_4_ * 0.0;
        auVar88._24_4_ = auVar100._24_4_ * 0.0;
        auVar88._28_4_ = auVar100._28_4_;
        auVar23 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar82),auVar98);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar89,auVar96);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar89,ZEXT1632(auVar75));
        auVar91 = ZEXT1632(auVar83);
        uVar63 = vcmpps_avx512vl(auVar98,auVar91,2);
        bVar61 = (byte)uVar63;
        fVar71 = (float)((uint)(bVar61 & 1) * auVar80._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar29._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar121 = (float)((uint)bVar68 * auVar80._4_4_ | (uint)!bVar68 * auVar29._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar123 = (float)((uint)bVar68 * auVar80._8_4_ | (uint)!bVar68 * auVar29._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar126 = (float)((uint)bVar68 * auVar80._12_4_ | (uint)!bVar68 * auVar29._12_4_);
        auVar86 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar123,CONCAT44(fVar121,fVar71))));
        fVar72 = (float)((uint)(bVar61 & 1) * auVar74._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar24._0_4_);
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        fVar122 = (float)((uint)bVar68 * auVar74._4_4_ | (uint)!bVar68 * auVar24._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        fVar124 = (float)((uint)bVar68 * auVar74._8_4_ | (uint)!bVar68 * auVar24._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        fVar127 = (float)((uint)bVar68 * auVar74._12_4_ | (uint)!bVar68 * auVar24._12_4_);
        auVar95 = ZEXT1632(CONCAT412(fVar127,CONCAT48(fVar124,CONCAT44(fVar122,fVar72))));
        auVar104._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar31._0_4_)
        ;
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar68 * auVar84._4_4_ | (uint)!bVar68 * auVar31._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar68 * auVar84._8_4_ | (uint)!bVar68 * auVar31._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar68 * auVar84._12_4_ | (uint)!bVar68 * auVar31._12_4_);
        fVar167 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar84._16_4_);
        auVar104._16_4_ = fVar167;
        fVar134 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar84._20_4_);
        auVar104._20_4_ = fVar134;
        fVar135 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar84._24_4_);
        auVar104._24_4_ = fVar135;
        iVar1 = (uint)(byte)(uVar63 >> 7) * auVar84._28_4_;
        auVar104._28_4_ = iVar1;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar85);
        auVar105._0_4_ =
             (uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar74._0_4_;
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar68 * auVar100._4_4_ | (uint)!bVar68 * auVar74._4_4_;
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar68 * auVar100._8_4_ | (uint)!bVar68 * auVar74._8_4_;
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar68 * auVar100._12_4_ | (uint)!bVar68 * auVar74._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_;
        auVar105._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar21));
        auVar106._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar75._0_4_
                    );
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar68 * auVar100._4_4_ | (uint)!bVar68 * auVar75._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar68 * auVar100._8_4_ | (uint)!bVar68 * auVar75._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar68 * auVar100._12_4_ | (uint)!bVar68 * auVar75._12_4_);
        fVar136 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
        auVar106._16_4_ = fVar136;
        fVar176 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
        auVar106._20_4_ = fVar176;
        fVar170 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
        auVar106._24_4_ = fVar170;
        auVar106._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
        auVar100 = vblendmps_avx512vl(auVar97,ZEXT1632(auVar22));
        auVar107._0_4_ =
             (float)((uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar84._0_4_
                    );
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar68 * auVar100._4_4_ | (uint)!bVar68 * auVar84._4_4_);
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar68 * auVar100._8_4_ | (uint)!bVar68 * auVar84._8_4_);
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar68 * auVar100._12_4_ | (uint)!bVar68 * auVar84._12_4_);
        bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar68 * auVar100._16_4_ | (uint)!bVar68 * auVar84._16_4_);
        bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar68 * auVar100._20_4_ | (uint)!bVar68 * auVar84._20_4_);
        bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar68 * auVar100._24_4_ | (uint)!bVar68 * auVar84._24_4_);
        bVar68 = SUB81(uVar63 >> 7,0);
        auVar107._28_4_ = (uint)bVar68 * auVar100._28_4_ | (uint)!bVar68 * auVar84._28_4_;
        auVar108._0_4_ =
             (uint)(bVar61 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar85._0_4_;
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar68 * (int)auVar82._4_4_ | (uint)!bVar68 * auVar85._4_4_;
        bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar68 * (int)auVar82._8_4_ | (uint)!bVar68 * auVar85._8_4_;
        bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar68 * (int)auVar82._12_4_ | (uint)!bVar68 * auVar85._12_4_;
        auVar108._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar85._16_4_;
        auVar108._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar85._20_4_;
        auVar108._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar85._24_4_;
        auVar108._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar85._28_4_;
        bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar109._0_4_ =
             (uint)(bVar61 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar22._0_4_;
        bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar22._4_4_;
        bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar22._8_4_;
        bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar22._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar97._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar97._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar97._24_4_;
        iVar2 = (uint)(byte)(uVar63 >> 7) * auVar97._28_4_;
        auVar109._28_4_ = iVar2;
        auVar87 = vsubps_avx512vl(auVar108,auVar86);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar73._12_4_ |
                                                 (uint)!bVar18 * auVar21._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar73._8_4_ |
                                                          (uint)!bVar16 * auVar21._8_4_,
                                                          CONCAT44((uint)bVar68 * (int)auVar73._4_4_
                                                                   | (uint)!bVar68 * auVar21._4_4_,
                                                                   (uint)(bVar61 & 1) *
                                                                   (int)auVar73._0_4_ |
                                                                   (uint)!(bool)(bVar61 & 1) *
                                                                   auVar21._0_4_)))),auVar95);
        auVar97 = vsubps_avx(auVar109,auVar104);
        auVar96 = vsubps_avx(auVar86,auVar105);
        auVar84 = vsubps_avx(auVar95,auVar106);
        auVar85 = vsubps_avx(auVar104,auVar107);
        auVar89._4_4_ = auVar97._4_4_ * fVar121;
        auVar89._0_4_ = auVar97._0_4_ * fVar71;
        auVar89._8_4_ = auVar97._8_4_ * fVar123;
        auVar89._12_4_ = auVar97._12_4_ * fVar126;
        auVar89._16_4_ = auVar97._16_4_ * 0.0;
        auVar89._20_4_ = auVar97._20_4_ * 0.0;
        auVar89._24_4_ = auVar97._24_4_ * 0.0;
        auVar89._28_4_ = iVar2;
        auVar80 = vfmsub231ps_fma(auVar89,auVar104,auVar87);
        auVar90._4_4_ = fVar122 * auVar87._4_4_;
        auVar90._0_4_ = fVar72 * auVar87._0_4_;
        auVar90._8_4_ = fVar124 * auVar87._8_4_;
        auVar90._12_4_ = fVar127 * auVar87._12_4_;
        auVar90._16_4_ = auVar87._16_4_ * 0.0;
        auVar90._20_4_ = auVar87._20_4_ * 0.0;
        auVar90._24_4_ = auVar87._24_4_ * 0.0;
        auVar90._28_4_ = auVar98._28_4_;
        auVar74 = vfmsub231ps_fma(auVar90,auVar86,auVar100);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar91,ZEXT1632(auVar80));
        auVar159._0_4_ = auVar100._0_4_ * auVar104._0_4_;
        auVar159._4_4_ = auVar100._4_4_ * auVar104._4_4_;
        auVar159._8_4_ = auVar100._8_4_ * auVar104._8_4_;
        auVar159._12_4_ = auVar100._12_4_ * auVar104._12_4_;
        auVar159._16_4_ = auVar100._16_4_ * fVar167;
        auVar159._20_4_ = auVar100._20_4_ * fVar134;
        auVar159._24_4_ = auVar100._24_4_ * fVar135;
        auVar159._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar159,auVar95,auVar97);
        auVar88 = vfmadd231ps_avx512vl(auVar98,auVar91,ZEXT1632(auVar80));
        auVar98 = vmulps_avx512vl(auVar85,auVar105);
        auVar98 = vfmsub231ps_avx512vl(auVar98,auVar96,auVar107);
        auVar94._4_4_ = auVar84._4_4_ * auVar107._4_4_;
        auVar94._0_4_ = auVar84._0_4_ * auVar107._0_4_;
        auVar94._8_4_ = auVar84._8_4_ * auVar107._8_4_;
        auVar94._12_4_ = auVar84._12_4_ * auVar107._12_4_;
        auVar94._16_4_ = auVar84._16_4_ * auVar107._16_4_;
        auVar94._20_4_ = auVar84._20_4_ * auVar107._20_4_;
        auVar94._24_4_ = auVar84._24_4_ * auVar107._24_4_;
        auVar94._28_4_ = auVar107._28_4_;
        auVar80 = vfmsub231ps_fma(auVar94,auVar106,auVar85);
        auVar160._0_4_ = auVar106._0_4_ * auVar96._0_4_;
        auVar160._4_4_ = auVar106._4_4_ * auVar96._4_4_;
        auVar160._8_4_ = auVar106._8_4_ * auVar96._8_4_;
        auVar160._12_4_ = auVar106._12_4_ * auVar96._12_4_;
        auVar160._16_4_ = fVar136 * auVar96._16_4_;
        auVar160._20_4_ = fVar176 * auVar96._20_4_;
        auVar160._24_4_ = fVar170 * auVar96._24_4_;
        auVar160._28_4_ = 0;
        auVar74 = vfmsub231ps_fma(auVar160,auVar84,auVar105);
        auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar91,auVar98);
        auVar89 = vfmadd231ps_avx512vl(auVar98,auVar91,ZEXT1632(auVar80));
        auVar98 = vmaxps_avx(auVar88,auVar89);
        uVar137 = vcmpps_avx512vl(auVar98,auVar91,2);
        bVar70 = bVar70 & (byte)uVar137;
        auVar190 = ZEXT3264(local_340);
        auVar196 = ZEXT3264(local_3e0);
        auVar192 = ZEXT3264(local_360);
        auVar194 = ZEXT3264(local_400);
        auVar191 = ZEXT3264(local_380);
        if (bVar70 == 0) {
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar188 = ZEXT3264(auVar98);
        }
        else {
          auVar38._4_4_ = auVar85._4_4_ * auVar100._4_4_;
          auVar38._0_4_ = auVar85._0_4_ * auVar100._0_4_;
          auVar38._8_4_ = auVar85._8_4_ * auVar100._8_4_;
          auVar38._12_4_ = auVar85._12_4_ * auVar100._12_4_;
          auVar38._16_4_ = auVar85._16_4_ * auVar100._16_4_;
          auVar38._20_4_ = auVar85._20_4_ * auVar100._20_4_;
          auVar38._24_4_ = auVar85._24_4_ * auVar100._24_4_;
          auVar38._28_4_ = auVar98._28_4_;
          auVar21 = vfmsub231ps_fma(auVar38,auVar84,auVar97);
          auVar39._4_4_ = auVar97._4_4_ * auVar96._4_4_;
          auVar39._0_4_ = auVar97._0_4_ * auVar96._0_4_;
          auVar39._8_4_ = auVar97._8_4_ * auVar96._8_4_;
          auVar39._12_4_ = auVar97._12_4_ * auVar96._12_4_;
          auVar39._16_4_ = auVar97._16_4_ * auVar96._16_4_;
          auVar39._20_4_ = auVar97._20_4_ * auVar96._20_4_;
          auVar39._24_4_ = auVar97._24_4_ * auVar96._24_4_;
          auVar39._28_4_ = auVar97._28_4_;
          auVar74 = vfmsub231ps_fma(auVar39,auVar87,auVar85);
          auVar40._4_4_ = auVar84._4_4_ * auVar87._4_4_;
          auVar40._0_4_ = auVar84._0_4_ * auVar87._0_4_;
          auVar40._8_4_ = auVar84._8_4_ * auVar87._8_4_;
          auVar40._12_4_ = auVar84._12_4_ * auVar87._12_4_;
          auVar40._16_4_ = auVar84._16_4_ * auVar87._16_4_;
          auVar40._20_4_ = auVar84._20_4_ * auVar87._20_4_;
          auVar40._24_4_ = auVar84._24_4_ * auVar87._24_4_;
          auVar40._28_4_ = auVar84._28_4_;
          auVar22 = vfmsub231ps_fma(auVar40,auVar96,auVar100);
          auVar80 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar74),ZEXT1632(auVar22));
          auVar100 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar21),auVar91);
          auVar98 = vrcp14ps_avx512vl(auVar100);
          auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar188 = ZEXT3264(auVar97);
          auVar96 = vfnmadd213ps_avx512vl(auVar98,auVar100,auVar97);
          auVar80 = vfmadd132ps_fma(auVar96,auVar98,auVar98);
          auVar41._4_4_ = auVar22._4_4_ * auVar104._4_4_;
          auVar41._0_4_ = auVar22._0_4_ * auVar104._0_4_;
          auVar41._8_4_ = auVar22._8_4_ * auVar104._8_4_;
          auVar41._12_4_ = auVar22._12_4_ * auVar104._12_4_;
          auVar41._16_4_ = fVar167 * 0.0;
          auVar41._20_4_ = fVar134 * 0.0;
          auVar41._24_4_ = fVar135 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar74 = vfmadd231ps_fma(auVar41,auVar95,ZEXT1632(auVar74));
          auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar86,ZEXT1632(auVar21));
          fVar134 = auVar80._0_4_;
          fVar135 = auVar80._4_4_;
          fVar136 = auVar80._8_4_;
          fVar176 = auVar80._12_4_;
          local_200 = ZEXT1632(CONCAT412(auVar74._12_4_ * fVar176,
                                         CONCAT48(auVar74._8_4_ * fVar136,
                                                  CONCAT44(auVar74._4_4_ * fVar135,
                                                           auVar74._0_4_ * fVar134))));
          auVar173._8_4_ = 3;
          auVar173._0_8_ = 0x300000003;
          auVar173._12_4_ = 3;
          auVar173._16_4_ = 3;
          auVar173._20_4_ = 3;
          auVar173._24_4_ = 3;
          auVar173._28_4_ = 3;
          auVar98 = vpermps_avx2(auVar173,ZEXT1632((undefined1  [16])aVar4));
          uVar137 = vcmpps_avx512vl(auVar98,local_200,2);
          fVar167 = local_518->tfar;
          auVar33._4_4_ = fVar167;
          auVar33._0_4_ = fVar167;
          auVar33._8_4_ = fVar167;
          auVar33._12_4_ = fVar167;
          auVar33._16_4_ = fVar167;
          auVar33._20_4_ = fVar167;
          auVar33._24_4_ = fVar167;
          auVar33._28_4_ = fVar167;
          uVar27 = vcmpps_avx512vl(local_200,auVar33,2);
          bVar70 = (byte)uVar137 & (byte)uVar27 & bVar70;
          if (bVar70 != 0) {
            uVar137 = vcmpps_avx512vl(auVar100,auVar91,4);
            bVar70 = bVar70 & (byte)uVar137;
            if (bVar70 != 0) {
              fVar167 = auVar88._0_4_ * fVar134;
              fVar170 = auVar88._4_4_ * fVar135;
              auVar42._4_4_ = fVar170;
              auVar42._0_4_ = fVar167;
              fVar71 = auVar88._8_4_ * fVar136;
              auVar42._8_4_ = fVar71;
              fVar72 = auVar88._12_4_ * fVar176;
              auVar42._12_4_ = fVar72;
              fVar121 = auVar88._16_4_ * 0.0;
              auVar42._16_4_ = fVar121;
              fVar122 = auVar88._20_4_ * 0.0;
              auVar42._20_4_ = fVar122;
              fVar123 = auVar88._24_4_ * 0.0;
              auVar42._24_4_ = fVar123;
              auVar42._28_4_ = auVar100._28_4_;
              auVar98 = vsubps_avx512vl(auVar97,auVar42);
              local_240._0_4_ =
                   (float)((uint)(bVar61 & 1) * (int)fVar167 |
                          (uint)!(bool)(bVar61 & 1) * auVar98._0_4_);
              bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
              local_240._4_4_ = (float)((uint)bVar68 * (int)fVar170 | (uint)!bVar68 * auVar98._4_4_)
              ;
              bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
              local_240._8_4_ = (float)((uint)bVar68 * (int)fVar71 | (uint)!bVar68 * auVar98._8_4_);
              bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
              local_240._12_4_ =
                   (float)((uint)bVar68 * (int)fVar72 | (uint)!bVar68 * auVar98._12_4_);
              bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
              local_240._16_4_ =
                   (float)((uint)bVar68 * (int)fVar121 | (uint)!bVar68 * auVar98._16_4_);
              bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
              local_240._20_4_ =
                   (float)((uint)bVar68 * (int)fVar122 | (uint)!bVar68 * auVar98._20_4_);
              bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
              local_240._24_4_ =
                   (float)((uint)bVar68 * (int)fVar123 | (uint)!bVar68 * auVar98._24_4_);
              bVar68 = SUB81(uVar63 >> 7,0);
              local_240._28_4_ =
                   (float)((uint)bVar68 * auVar100._28_4_ | (uint)!bVar68 * auVar98._28_4_);
              auVar98 = vsubps_avx(ZEXT1632(auVar76),auVar92);
              auVar80 = vfmadd213ps_fma(auVar98,local_240,auVar92);
              fVar167 = local_508->depth_scale;
              auVar92._4_4_ = fVar167;
              auVar92._0_4_ = fVar167;
              auVar92._8_4_ = fVar167;
              auVar92._12_4_ = fVar167;
              auVar92._16_4_ = fVar167;
              auVar92._20_4_ = fVar167;
              auVar92._24_4_ = fVar167;
              auVar92._28_4_ = fVar167;
              auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar80._12_4_ + auVar80._12_4_,
                                                           CONCAT48(auVar80._8_4_ + auVar80._8_4_,
                                                                    CONCAT44(auVar80._4_4_ +
                                                                             auVar80._4_4_,
                                                                             auVar80._0_4_ +
                                                                             auVar80._0_4_)))),
                                        auVar92);
              uVar137 = vcmpps_avx512vl(local_200,auVar98,6);
              if (((byte)uVar137 & bVar70) != 0) {
                auVar7._0_4_ = local_518->tfar;
                auVar7._4_4_ = local_518->mask;
                auVar7._8_4_ = local_518->id;
                auVar7._12_4_ = local_518->flags;
                uVar62 = vextractps_avx(auVar7,1);
                auVar155._0_4_ = auVar89._0_4_ * fVar134;
                auVar155._4_4_ = auVar89._4_4_ * fVar135;
                auVar155._8_4_ = auVar89._8_4_ * fVar136;
                auVar155._12_4_ = auVar89._12_4_ * fVar176;
                auVar155._16_4_ = auVar89._16_4_ * 0.0;
                auVar155._20_4_ = auVar89._20_4_ * 0.0;
                auVar155._24_4_ = auVar89._24_4_ * 0.0;
                auVar155._28_4_ = 0;
                auVar98 = vsubps_avx512vl(auVar97,auVar155);
                auVar110._0_4_ =
                     (uint)(bVar61 & 1) * (int)auVar155._0_4_ |
                     (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
                bVar68 = (bool)((byte)(uVar63 >> 1) & 1);
                auVar110._4_4_ = (uint)bVar68 * (int)auVar155._4_4_ | (uint)!bVar68 * auVar98._4_4_;
                bVar68 = (bool)((byte)(uVar63 >> 2) & 1);
                auVar110._8_4_ = (uint)bVar68 * (int)auVar155._8_4_ | (uint)!bVar68 * auVar98._8_4_;
                bVar68 = (bool)((byte)(uVar63 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar68 * (int)auVar155._12_4_ | (uint)!bVar68 * auVar98._12_4_;
                bVar68 = (bool)((byte)(uVar63 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar68 * (int)auVar155._16_4_ | (uint)!bVar68 * auVar98._16_4_;
                bVar68 = (bool)((byte)(uVar63 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar68 * (int)auVar155._20_4_ | (uint)!bVar68 * auVar98._20_4_;
                bVar68 = (bool)((byte)(uVar63 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar68 * (int)auVar155._24_4_ | (uint)!bVar68 * auVar98._24_4_;
                auVar110._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar98._28_4_;
                auVar34._8_4_ = 0x40000000;
                auVar34._0_8_ = 0x4000000040000000;
                auVar34._12_4_ = 0x40000000;
                auVar34._16_4_ = 0x40000000;
                auVar34._20_4_ = 0x40000000;
                auVar34._24_4_ = 0x40000000;
                auVar34._28_4_ = 0x40000000;
                local_220 = vfmsub132ps_avx512vl(auVar110,auVar97,auVar34);
                local_1e0 = 0;
                local_1dc = iVar10;
                local_1d0 = local_460._0_8_;
                uStack_1c8 = local_460._8_8_;
                local_1c0 = local_470._0_8_;
                uStack_1b8 = local_470._8_8_;
                local_1b0 = local_480._0_8_;
                uStack_1a8 = local_480._8_8_;
                if ((pGVar11->mask & uVar62) != 0) {
                  if ((local_520->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar68 = true, local_480 = auVar25, local_470 = auVar26, local_460 = auVar30,
                     pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar167 = 1.0 / auVar93._0_4_;
                    local_180[0] = fVar167 * (local_240._0_4_ + 0.0);
                    local_180[1] = fVar167 * (local_240._4_4_ + 1.0);
                    local_180[2] = fVar167 * (local_240._8_4_ + 2.0);
                    local_180[3] = fVar167 * (local_240._12_4_ + 3.0);
                    fStack_170 = fVar167 * (local_240._16_4_ + 4.0);
                    fStack_16c = fVar167 * (local_240._20_4_ + 5.0);
                    fStack_168 = fVar167 * (local_240._24_4_ + 6.0);
                    fStack_164 = local_240._28_4_ + 7.0;
                    local_160 = local_220;
                    local_140 = local_200;
                    lVar66 = 0;
                    uVar64 = (ulong)((byte)uVar137 & bVar70);
                    for (uVar63 = uVar64; (uVar63 & 1) == 0;
                        uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                      lVar66 = lVar66 + 1;
                    }
                    local_300._0_16_ = auVar81;
                    local_490 = auVar7;
                    local_480 = auVar25;
                    local_470 = auVar26;
                    local_460 = auVar30;
                    do {
                      auVar74 = auVar189._0_16_;
                      local_4c4 = local_180[lVar66];
                      local_4c0 = *(undefined4 *)(local_160 + lVar66 * 4);
                      local_280._0_8_ = lVar66;
                      local_518->tfar = *(float *)(local_140 + lVar66 * 4);
                      local_500.context = local_520->user;
                      fVar134 = 1.0 - local_4c4;
                      fVar167 = fVar134 * fVar134 * -3.0;
                      auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),
                                                ZEXT416((uint)(local_4c4 * fVar134)),
                                                ZEXT416(0xc0000000));
                      auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar134)),
                                                ZEXT416((uint)(local_4c4 * local_4c4)),
                                                ZEXT416(0x40000000));
                      fVar134 = auVar81._0_4_ * 3.0;
                      fVar135 = auVar80._0_4_ * 3.0;
                      fVar136 = local_4c4 * local_4c4 * 3.0;
                      auVar165._0_4_ = fVar136 * (float)local_310._0_4_;
                      auVar165._4_4_ = fVar136 * (float)local_310._4_4_;
                      auVar165._8_4_ = fVar136 * fStack_308;
                      auVar165._12_4_ = fVar136 * fStack_304;
                      auVar149._4_4_ = fVar135;
                      auVar149._0_4_ = fVar135;
                      auVar149._8_4_ = fVar135;
                      auVar149._12_4_ = fVar135;
                      auVar81 = vfmadd132ps_fma(auVar149,auVar165,local_480);
                      auVar153._4_4_ = fVar134;
                      auVar153._0_4_ = fVar134;
                      auVar153._8_4_ = fVar134;
                      auVar153._12_4_ = fVar134;
                      auVar81 = vfmadd132ps_fma(auVar153,auVar81,local_470);
                      auVar150._4_4_ = fVar167;
                      auVar150._0_4_ = fVar167;
                      auVar150._8_4_ = fVar167;
                      auVar150._12_4_ = fVar167;
                      auVar81 = vfmadd132ps_fma(auVar150,auVar81,local_460);
                      local_4d0 = vmovlps_avx(auVar81);
                      local_4c8 = vextractps_avx(auVar81,2);
                      local_4bc = (int)local_498;
                      local_4b8 = (int)local_510;
                      local_4b4 = (local_500.context)->instID[0];
                      local_4b0 = (local_500.context)->instPrimID[0];
                      local_524 = -1;
                      local_500.valid = &local_524;
                      local_500.geometryUserPtr = pGVar11->userPtr;
                      local_500.ray = (RTCRayN *)local_518;
                      local_500.hit = (RTCHitN *)&local_4d0;
                      local_500.N = 1;
                      if ((pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar11->occlusionFilterN)(&local_500), *local_500.valid != 0)) {
                        p_Var14 = local_520->args->filter;
                        if ((p_Var14 == (RTCFilterFunctionN)0x0) ||
                           ((((local_520->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                              == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar11->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var14)(&local_500), *local_500.valid != 0)))) {
                          bVar68 = true;
                          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar188 = ZEXT3264(auVar98);
                          auVar81 = vxorps_avx512vl(auVar74,auVar74);
                          auVar189 = ZEXT1664(auVar81);
                          auVar187 = ZEXT3264(local_3c0);
                          auVar190 = ZEXT3264(local_340);
                          auVar196 = ZEXT3264(local_3e0);
                          auVar192 = ZEXT3264(local_360);
                          auVar194 = ZEXT3264(local_400);
                          auVar193 = ZEXT3264(local_420);
                          auVar191 = ZEXT3264(local_380);
                          auVar195 = ZEXT3264(local_3a0);
                          auVar81 = local_300._0_16_;
                          break;
                        }
                      }
                      local_518->tfar = (float)local_490._0_4_;
                      bVar68 = false;
                      lVar66 = 0;
                      uVar64 = uVar64 ^ 1L << (local_280._0_8_ & 0x3f);
                      for (uVar63 = uVar64; (uVar63 & 1) == 0;
                          uVar63 = uVar63 >> 1 | 0x8000000000000000) {
                        lVar66 = lVar66 + 1;
                      }
                      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar188 = ZEXT3264(auVar98);
                      auVar81 = vxorps_avx512vl(auVar74,auVar74);
                      auVar189 = ZEXT1664(auVar81);
                      auVar187 = ZEXT3264(local_3c0);
                      auVar190 = ZEXT3264(local_340);
                      auVar196 = ZEXT3264(local_3e0);
                      auVar192 = ZEXT3264(local_360);
                      auVar194 = ZEXT3264(local_400);
                      auVar193 = ZEXT3264(local_420);
                      auVar191 = ZEXT3264(local_380);
                      auVar195 = ZEXT3264(local_3a0);
                      auVar81 = local_300._0_16_;
                    } while (uVar64 != 0);
                  }
                  goto LAB_01b7a215;
                }
              }
            }
            bVar68 = false;
            local_480 = auVar25;
            local_470 = auVar26;
            local_460 = auVar30;
            goto LAB_01b7a215;
          }
        }
        bVar68 = false;
        local_480 = auVar25;
        local_470 = auVar26;
        local_460 = auVar30;
      }
LAB_01b7a215:
      context = local_520;
      ray = local_518;
      if (8 < iVar10) {
        local_280 = vpbroadcastd_avx512vl();
        local_300 = vbroadcastss_avx512vl(auVar81);
        auVar133._8_4_ = 3;
        auVar133._0_8_ = 0x300000003;
        auVar133._12_4_ = 3;
        auVar133._16_4_ = 3;
        auVar133._20_4_ = 3;
        auVar133._24_4_ = 3;
        auVar133._28_4_ = 3;
        local_2a0 = vpermps_avx2(auVar133,local_2a0);
        local_2c0._4_4_ = 1.0 / (float)local_2c0._0_4_;
        local_2c0._0_4_ = local_2c0._4_4_;
        fStack_2b8 = (float)local_2c0._4_4_;
        fStack_2b4 = (float)local_2c0._4_4_;
        fStack_2b0 = (float)local_2c0._4_4_;
        fStack_2ac = (float)local_2c0._4_4_;
        fStack_2a8 = (float)local_2c0._4_4_;
        fStack_2a4 = (float)local_2c0._4_4_;
        lVar66 = 8;
        do {
          auVar98 = vpbroadcastd_avx512vl();
          auVar84 = vpor_avx2(auVar98,_DAT_01fe9900);
          uVar27 = vpcmpd_avx512vl(auVar84,local_280,1);
          auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar66 * 4 + lVar28);
          auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar66 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar66 * 4);
          auVar96 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar66 * 4);
          local_380 = auVar191._0_32_;
          auVar85 = vmulps_avx512vl(local_380,auVar96);
          local_3a0 = auVar195._0_32_;
          auVar86 = vmulps_avx512vl(local_3a0,auVar96);
          auVar43._4_4_ = auVar96._4_4_ * (float)local_e0._4_4_;
          auVar43._0_4_ = auVar96._0_4_ * (float)local_e0._0_4_;
          auVar43._8_4_ = auVar96._8_4_ * fStack_d8;
          auVar43._12_4_ = auVar96._12_4_ * fStack_d4;
          auVar43._16_4_ = auVar96._16_4_ * fStack_d0;
          auVar43._20_4_ = auVar96._20_4_ * fStack_cc;
          auVar43._24_4_ = auVar96._24_4_ * fStack_c8;
          auVar43._28_4_ = auVar84._28_4_;
          auVar103 = auVar194._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar103);
          auVar102 = auVar193._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar102);
          auVar86 = vfmadd231ps_avx512vl(auVar43,auVar97,local_c0);
          auVar104 = auVar196._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar100,auVar104);
          local_360 = auVar192._0_32_;
          auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_360);
          auVar81 = vfmadd231ps_fma(auVar86,auVar100,local_a0);
          auVar101 = auVar187._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar84,auVar98,auVar101);
          local_340 = auVar190._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar85,auVar98,local_340);
          auVar84 = *(undefined1 (*) [32])(bezier_basis1 + lVar66 * 4 + lVar28);
          auVar85 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar66 * 4);
          auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar98,local_80);
          auVar86 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar66 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar66 * 4);
          auVar87 = vmulps_avx512vl(local_380,auVar95);
          auVar88 = vmulps_avx512vl(local_3a0,auVar95);
          auVar44._4_4_ = auVar95._4_4_ * (float)local_e0._4_4_;
          auVar44._0_4_ = auVar95._0_4_ * (float)local_e0._0_4_;
          auVar44._8_4_ = auVar95._8_4_ * fStack_d8;
          auVar44._12_4_ = auVar95._12_4_ * fStack_d4;
          auVar44._16_4_ = auVar95._16_4_ * fStack_d0;
          auVar44._20_4_ = auVar95._20_4_ * fStack_cc;
          auVar44._24_4_ = auVar95._24_4_ * fStack_c8;
          auVar44._28_4_ = uStack_c4;
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar103);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar102);
          auVar91 = vfmadd231ps_avx512vl(auVar44,auVar86,local_c0);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar85,auVar104);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar85,local_360);
          auVar80 = vfmadd231ps_fma(auVar91,auVar85,local_a0);
          auVar91 = vfmadd231ps_avx512vl(auVar87,auVar84,auVar101);
          auVar92 = vfmadd231ps_avx512vl(auVar88,auVar84,local_340);
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar84,local_80);
          auVar93 = vmaxps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar80));
          auVar87 = vsubps_avx(auVar91,auVar89);
          auVar88 = vsubps_avx(auVar92,auVar90);
          auVar94 = vmulps_avx512vl(auVar90,auVar87);
          auVar99 = vmulps_avx512vl(auVar89,auVar88);
          auVar94 = vsubps_avx512vl(auVar94,auVar99);
          auVar99 = vmulps_avx512vl(auVar88,auVar88);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar87);
          auVar93 = vmulps_avx512vl(auVar93,auVar93);
          auVar93 = vmulps_avx512vl(auVar93,auVar99);
          auVar94 = vmulps_avx512vl(auVar94,auVar94);
          uVar137 = vcmpps_avx512vl(auVar94,auVar93,2);
          bVar70 = (byte)uVar27 & (byte)uVar137;
          if (bVar70 == 0) {
            auVar187 = ZEXT3264(auVar101);
          }
          else {
            auVar95 = vmulps_avx512vl(local_440,auVar95);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_120,auVar95);
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_100,auVar86);
            auVar84 = vfmadd213ps_avx512vl(auVar84,local_2e0,auVar85);
            auVar96 = vmulps_avx512vl(local_440,auVar96);
            auVar97 = vfmadd213ps_avx512vl(auVar97,local_120,auVar96);
            auVar100 = vfmadd213ps_avx512vl(auVar100,local_100,auVar97);
            auVar85 = vfmadd213ps_avx512vl(auVar98,local_2e0,auVar100);
            auVar98 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar66 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar66 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar66 * 4);
            auVar96 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar66 * 4);
            auVar86 = vmulps_avx512vl(local_380,auVar96);
            auVar95 = vmulps_avx512vl(local_3a0,auVar96);
            auVar96 = vmulps_avx512vl(local_440,auVar96);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar97,auVar103);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar97,auVar102);
            auVar97 = vfmadd231ps_avx512vl(auVar96,local_120,auVar97);
            auVar96 = vfmadd231ps_avx512vl(auVar86,auVar100,auVar104);
            auVar86 = vfmadd231ps_avx512vl(auVar95,auVar100,local_360);
            auVar100 = vfmadd231ps_avx512vl(auVar97,local_100,auVar100);
            auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar101);
            auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_340);
            auVar95 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar98);
            auVar98 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar66 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar66 * 4);
            auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar66 * 4);
            auVar93 = vmulps_avx512vl(local_380,auVar97);
            auVar94 = vmulps_avx512vl(local_3a0,auVar97);
            auVar97 = vmulps_avx512vl(local_440,auVar97);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar103);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,auVar102);
            auVar97 = vfmadd231ps_avx512vl(auVar97,local_120,auVar100);
            auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar66 * 4);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar104);
            auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_360);
            auVar100 = vfmadd231ps_avx512vl(auVar97,local_100,auVar100);
            auVar97 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar101);
            auVar93 = vfmadd231ps_avx512vl(auVar94,auVar98,local_340);
            auVar100 = vfmadd231ps_avx512vl(auVar100,local_2e0,auVar98);
            auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar96,auVar94);
            vandps_avx512vl(auVar86,auVar94);
            auVar98 = vmaxps_avx(auVar94,auVar94);
            vandps_avx512vl(auVar95,auVar94);
            auVar98 = vmaxps_avx(auVar98,auVar94);
            uVar63 = vcmpps_avx512vl(auVar98,local_300,1);
            bVar15 = (bool)((byte)uVar63 & 1);
            auVar111._0_4_ = (float)((uint)bVar15 * auVar87._0_4_ | (uint)!bVar15 * auVar96._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar15 * auVar87._4_4_ | (uint)!bVar15 * auVar96._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar15 * auVar87._8_4_ | (uint)!bVar15 * auVar96._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar15 * auVar87._12_4_ | (uint)!bVar15 * auVar96._12_4_);
            bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar15 * auVar87._16_4_ | (uint)!bVar15 * auVar96._16_4_);
            bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar15 * auVar87._20_4_ | (uint)!bVar15 * auVar96._20_4_);
            bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar15 * auVar87._24_4_ | (uint)!bVar15 * auVar96._24_4_);
            bVar15 = SUB81(uVar63 >> 7,0);
            auVar111._28_4_ = (uint)bVar15 * auVar87._28_4_ | (uint)!bVar15 * auVar96._28_4_;
            bVar15 = (bool)((byte)uVar63 & 1);
            auVar112._0_4_ = (float)((uint)bVar15 * auVar88._0_4_ | (uint)!bVar15 * auVar86._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar112._4_4_ = (float)((uint)bVar15 * auVar88._4_4_ | (uint)!bVar15 * auVar86._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar112._8_4_ = (float)((uint)bVar15 * auVar88._8_4_ | (uint)!bVar15 * auVar86._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar112._12_4_ =
                 (float)((uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * auVar86._12_4_);
            bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar112._16_4_ =
                 (float)((uint)bVar15 * auVar88._16_4_ | (uint)!bVar15 * auVar86._16_4_);
            bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar112._20_4_ =
                 (float)((uint)bVar15 * auVar88._20_4_ | (uint)!bVar15 * auVar86._20_4_);
            bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar112._24_4_ =
                 (float)((uint)bVar15 * auVar88._24_4_ | (uint)!bVar15 * auVar86._24_4_);
            bVar15 = SUB81(uVar63 >> 7,0);
            auVar112._28_4_ = (uint)bVar15 * auVar88._28_4_ | (uint)!bVar15 * auVar86._28_4_;
            vandps_avx512vl(auVar97,auVar94);
            vandps_avx512vl(auVar93,auVar94);
            auVar98 = vmaxps_avx(auVar112,auVar112);
            vandps_avx512vl(auVar100,auVar94);
            auVar98 = vmaxps_avx(auVar98,auVar112);
            uVar63 = vcmpps_avx512vl(auVar98,local_300,1);
            bVar15 = (bool)((byte)uVar63 & 1);
            auVar113._0_4_ = (uint)bVar15 * auVar87._0_4_ | (uint)!bVar15 * auVar97._0_4_;
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar113._4_4_ = (uint)bVar15 * auVar87._4_4_ | (uint)!bVar15 * auVar97._4_4_;
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar113._8_4_ = (uint)bVar15 * auVar87._8_4_ | (uint)!bVar15 * auVar97._8_4_;
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar113._12_4_ = (uint)bVar15 * auVar87._12_4_ | (uint)!bVar15 * auVar97._12_4_;
            bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar113._16_4_ = (uint)bVar15 * auVar87._16_4_ | (uint)!bVar15 * auVar97._16_4_;
            bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar113._20_4_ = (uint)bVar15 * auVar87._20_4_ | (uint)!bVar15 * auVar97._20_4_;
            bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar113._24_4_ = (uint)bVar15 * auVar87._24_4_ | (uint)!bVar15 * auVar97._24_4_;
            bVar15 = SUB81(uVar63 >> 7,0);
            auVar113._28_4_ = (uint)bVar15 * auVar87._28_4_ | (uint)!bVar15 * auVar97._28_4_;
            bVar15 = (bool)((byte)uVar63 & 1);
            auVar114._0_4_ = (float)((uint)bVar15 * auVar88._0_4_ | (uint)!bVar15 * auVar93._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar15 * auVar88._4_4_ | (uint)!bVar15 * auVar93._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar15 * auVar88._8_4_ | (uint)!bVar15 * auVar93._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * auVar93._12_4_);
            bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar114._16_4_ =
                 (float)((uint)bVar15 * auVar88._16_4_ | (uint)!bVar15 * auVar93._16_4_);
            bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar114._20_4_ =
                 (float)((uint)bVar15 * auVar88._20_4_ | (uint)!bVar15 * auVar93._20_4_);
            bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar114._24_4_ =
                 (float)((uint)bVar15 * auVar88._24_4_ | (uint)!bVar15 * auVar93._24_4_);
            bVar15 = SUB81(uVar63 >> 7,0);
            auVar114._28_4_ = (uint)bVar15 * auVar88._28_4_ | (uint)!bVar15 * auVar93._28_4_;
            auVar178._8_4_ = 0x80000000;
            auVar178._0_8_ = 0x8000000080000000;
            auVar178._12_4_ = 0x80000000;
            auVar178._16_4_ = 0x80000000;
            auVar178._20_4_ = 0x80000000;
            auVar178._24_4_ = 0x80000000;
            auVar178._28_4_ = 0x80000000;
            auVar98 = vxorps_avx512vl(auVar113,auVar178);
            auVar93 = auVar189._0_32_;
            auVar100 = vfmadd213ps_avx512vl(auVar111,auVar111,auVar93);
            auVar74 = vfmadd231ps_fma(auVar100,auVar112,auVar112);
            auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar74));
            auVar186._8_4_ = 0xbf000000;
            auVar186._0_8_ = 0xbf000000bf000000;
            auVar186._12_4_ = 0xbf000000;
            auVar186._16_4_ = 0xbf000000;
            auVar186._20_4_ = 0xbf000000;
            auVar186._24_4_ = 0xbf000000;
            auVar186._28_4_ = 0xbf000000;
            fVar167 = auVar100._0_4_;
            fVar134 = auVar100._4_4_;
            fVar135 = auVar100._8_4_;
            fVar136 = auVar100._12_4_;
            fVar176 = auVar100._16_4_;
            fVar170 = auVar100._20_4_;
            fVar71 = auVar100._24_4_;
            auVar45._4_4_ = fVar134 * fVar134 * fVar134 * auVar74._4_4_ * -0.5;
            auVar45._0_4_ = fVar167 * fVar167 * fVar167 * auVar74._0_4_ * -0.5;
            auVar45._8_4_ = fVar135 * fVar135 * fVar135 * auVar74._8_4_ * -0.5;
            auVar45._12_4_ = fVar136 * fVar136 * fVar136 * auVar74._12_4_ * -0.5;
            auVar45._16_4_ = fVar176 * fVar176 * fVar176 * -0.0;
            auVar45._20_4_ = fVar170 * fVar170 * fVar170 * -0.0;
            auVar45._24_4_ = fVar71 * fVar71 * fVar71 * -0.0;
            auVar45._28_4_ = auVar112._28_4_;
            auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar100 = vfmadd231ps_avx512vl(auVar45,auVar97,auVar100);
            auVar46._4_4_ = auVar112._4_4_ * auVar100._4_4_;
            auVar46._0_4_ = auVar112._0_4_ * auVar100._0_4_;
            auVar46._8_4_ = auVar112._8_4_ * auVar100._8_4_;
            auVar46._12_4_ = auVar112._12_4_ * auVar100._12_4_;
            auVar46._16_4_ = auVar112._16_4_ * auVar100._16_4_;
            auVar46._20_4_ = auVar112._20_4_ * auVar100._20_4_;
            auVar46._24_4_ = auVar112._24_4_ * auVar100._24_4_;
            auVar46._28_4_ = 0;
            auVar47._4_4_ = auVar100._4_4_ * -auVar111._4_4_;
            auVar47._0_4_ = auVar100._0_4_ * -auVar111._0_4_;
            auVar47._8_4_ = auVar100._8_4_ * -auVar111._8_4_;
            auVar47._12_4_ = auVar100._12_4_ * -auVar111._12_4_;
            auVar47._16_4_ = auVar100._16_4_ * -auVar111._16_4_;
            auVar47._20_4_ = auVar100._20_4_ * -auVar111._20_4_;
            auVar47._24_4_ = auVar100._24_4_ * -auVar111._24_4_;
            auVar47._28_4_ = auVar112._28_4_;
            auVar96 = vmulps_avx512vl(auVar100,auVar93);
            auVar100 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar93);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar114,auVar114);
            auVar86 = vrsqrt14ps_avx512vl(auVar100);
            auVar100 = vmulps_avx512vl(auVar100,auVar186);
            fVar167 = auVar86._0_4_;
            fVar134 = auVar86._4_4_;
            fVar135 = auVar86._8_4_;
            fVar136 = auVar86._12_4_;
            fVar176 = auVar86._16_4_;
            fVar170 = auVar86._20_4_;
            fVar71 = auVar86._24_4_;
            auVar48._4_4_ = fVar134 * fVar134 * fVar134 * auVar100._4_4_;
            auVar48._0_4_ = fVar167 * fVar167 * fVar167 * auVar100._0_4_;
            auVar48._8_4_ = fVar135 * fVar135 * fVar135 * auVar100._8_4_;
            auVar48._12_4_ = fVar136 * fVar136 * fVar136 * auVar100._12_4_;
            auVar48._16_4_ = fVar176 * fVar176 * fVar176 * auVar100._16_4_;
            auVar48._20_4_ = fVar170 * fVar170 * fVar170 * auVar100._20_4_;
            auVar48._24_4_ = fVar71 * fVar71 * fVar71 * auVar100._24_4_;
            auVar48._28_4_ = auVar100._28_4_;
            auVar100 = vfmadd231ps_avx512vl(auVar48,auVar97,auVar86);
            auVar49._4_4_ = auVar114._4_4_ * auVar100._4_4_;
            auVar49._0_4_ = auVar114._0_4_ * auVar100._0_4_;
            auVar49._8_4_ = auVar114._8_4_ * auVar100._8_4_;
            auVar49._12_4_ = auVar114._12_4_ * auVar100._12_4_;
            auVar49._16_4_ = auVar114._16_4_ * auVar100._16_4_;
            auVar49._20_4_ = auVar114._20_4_ * auVar100._20_4_;
            auVar49._24_4_ = auVar114._24_4_ * auVar100._24_4_;
            auVar49._28_4_ = auVar86._28_4_;
            auVar50._4_4_ = auVar100._4_4_ * auVar98._4_4_;
            auVar50._0_4_ = auVar100._0_4_ * auVar98._0_4_;
            auVar50._8_4_ = auVar100._8_4_ * auVar98._8_4_;
            auVar50._12_4_ = auVar100._12_4_ * auVar98._12_4_;
            auVar50._16_4_ = auVar100._16_4_ * auVar98._16_4_;
            auVar50._20_4_ = auVar100._20_4_ * auVar98._20_4_;
            auVar50._24_4_ = auVar100._24_4_ * auVar98._24_4_;
            auVar50._28_4_ = auVar98._28_4_;
            auVar98 = vmulps_avx512vl(auVar100,auVar93);
            auVar74 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar81),auVar89);
            auVar100 = ZEXT1632(auVar81);
            auVar21 = vfmadd213ps_fma(auVar47,auVar100,auVar90);
            auVar97 = vfmadd213ps_avx512vl(auVar96,auVar100,auVar85);
            auVar86 = vfmadd213ps_avx512vl(auVar49,ZEXT1632(auVar80),auVar91);
            auVar76 = vfnmadd213ps_fma(auVar46,auVar100,auVar89);
            auVar95 = ZEXT1632(auVar80);
            auVar22 = vfmadd213ps_fma(auVar50,auVar95,auVar92);
            auVar25 = vfnmadd213ps_fma(auVar47,auVar100,auVar90);
            auVar75 = vfmadd213ps_fma(auVar98,auVar95,auVar84);
            auVar90 = ZEXT1632(auVar81);
            auVar82 = vfnmadd231ps_fma(auVar85,auVar90,auVar96);
            auVar26 = vfnmadd213ps_fma(auVar49,auVar95,auVar91);
            auVar30 = vfnmadd213ps_fma(auVar50,auVar95,auVar92);
            auVar73 = vfnmadd231ps_fma(auVar84,ZEXT1632(auVar80),auVar98);
            auVar84 = vsubps_avx512vl(auVar86,ZEXT1632(auVar76));
            auVar98 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar25));
            auVar100 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar82));
            auVar51._4_4_ = auVar98._4_4_ * auVar82._4_4_;
            auVar51._0_4_ = auVar98._0_4_ * auVar82._0_4_;
            auVar51._8_4_ = auVar98._8_4_ * auVar82._8_4_;
            auVar51._12_4_ = auVar98._12_4_ * auVar82._12_4_;
            auVar51._16_4_ = auVar98._16_4_ * 0.0;
            auVar51._20_4_ = auVar98._20_4_ * 0.0;
            auVar51._24_4_ = auVar98._24_4_ * 0.0;
            auVar51._28_4_ = auVar96._28_4_;
            auVar81 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar25),auVar100);
            auVar52._4_4_ = auVar100._4_4_ * auVar76._4_4_;
            auVar52._0_4_ = auVar100._0_4_ * auVar76._0_4_;
            auVar52._8_4_ = auVar100._8_4_ * auVar76._8_4_;
            auVar52._12_4_ = auVar100._12_4_ * auVar76._12_4_;
            auVar52._16_4_ = auVar100._16_4_ * 0.0;
            auVar52._20_4_ = auVar100._20_4_ * 0.0;
            auVar52._24_4_ = auVar100._24_4_ * 0.0;
            auVar52._28_4_ = auVar100._28_4_;
            auVar23 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar82),auVar84);
            auVar53._4_4_ = auVar25._4_4_ * auVar84._4_4_;
            auVar53._0_4_ = auVar25._0_4_ * auVar84._0_4_;
            auVar53._8_4_ = auVar25._8_4_ * auVar84._8_4_;
            auVar53._12_4_ = auVar25._12_4_ * auVar84._12_4_;
            auVar53._16_4_ = auVar84._16_4_ * 0.0;
            auVar53._20_4_ = auVar84._20_4_ * 0.0;
            auVar53._24_4_ = auVar84._24_4_ * 0.0;
            auVar53._28_4_ = auVar84._28_4_;
            auVar24 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar76),auVar98);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar93,ZEXT1632(auVar23));
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar81));
            uVar63 = vcmpps_avx512vl(auVar98,auVar93,2);
            bVar61 = (byte)uVar63;
            fVar122 = (float)((uint)(bVar61 & 1) * auVar74._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar26._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            fVar124 = (float)((uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar26._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            fVar127 = (float)((uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar26._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            fVar128 = (float)((uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar26._12_4_);
            auVar95 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar127,CONCAT44(fVar124,fVar122))));
            fVar123 = (float)((uint)(bVar61 & 1) * auVar21._0_4_ |
                             (uint)!(bool)(bVar61 & 1) * auVar30._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            fVar126 = (float)((uint)bVar15 * auVar21._4_4_ | (uint)!bVar15 * auVar30._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            fVar125 = (float)((uint)bVar15 * auVar21._8_4_ | (uint)!bVar15 * auVar30._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            fVar129 = (float)((uint)bVar15 * auVar21._12_4_ | (uint)!bVar15 * auVar30._12_4_);
            auVar87 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar125,CONCAT44(fVar126,fVar123))));
            auVar115._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar97._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar73._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar115._4_4_ = (float)((uint)bVar15 * auVar97._4_4_ | (uint)!bVar15 * auVar73._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar115._8_4_ = (float)((uint)bVar15 * auVar97._8_4_ | (uint)!bVar15 * auVar73._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar115._12_4_ =
                 (float)((uint)bVar15 * auVar97._12_4_ | (uint)!bVar15 * auVar73._12_4_);
            fVar135 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar97._16_4_);
            auVar115._16_4_ = fVar135;
            fVar134 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar97._20_4_);
            auVar115._20_4_ = fVar134;
            fVar167 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar97._24_4_);
            auVar115._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar63 >> 7) * auVar97._28_4_;
            auVar115._28_4_ = iVar1;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar76),auVar86);
            auVar116._0_4_ =
                 (uint)(bVar61 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar81._0_4_;
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar116._4_4_ = (uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar81._4_4_;
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar116._8_4_ = (uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar81._8_4_;
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar116._12_4_ = (uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar81._12_4_;
            auVar116._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar98._16_4_;
            auVar116._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar98._20_4_;
            auVar116._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar98._24_4_;
            auVar116._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar25),ZEXT1632(auVar22));
            auVar117._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar74._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar74._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar74._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar74._12_4_);
            fVar170 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar98._16_4_);
            auVar117._16_4_ = fVar170;
            fVar176 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar98._20_4_);
            auVar117._20_4_ = fVar176;
            fVar136 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar98._24_4_);
            auVar117._24_4_ = fVar136;
            auVar117._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar98._28_4_;
            auVar98 = vblendmps_avx512vl(ZEXT1632(auVar82),ZEXT1632(auVar75));
            auVar118._0_4_ =
                 (float)((uint)(bVar61 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar61 & 1) * auVar21._0_4_);
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar15 * auVar98._4_4_ | (uint)!bVar15 * auVar21._4_4_);
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar15 * auVar98._8_4_ | (uint)!bVar15 * auVar21._8_4_);
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar15 * auVar98._12_4_ | (uint)!bVar15 * auVar21._12_4_);
            fVar72 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar98._16_4_);
            auVar118._16_4_ = fVar72;
            fVar121 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar98._20_4_);
            auVar118._20_4_ = fVar121;
            fVar71 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar98._24_4_);
            auVar118._24_4_ = fVar71;
            iVar2 = (uint)(byte)(uVar63 >> 7) * auVar98._28_4_;
            auVar118._28_4_ = iVar2;
            auVar119._0_4_ =
                 (uint)(bVar61 & 1) * (int)auVar76._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar86._0_4_
            ;
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar15 * (int)auVar76._4_4_ | (uint)!bVar15 * auVar86._4_4_;
            bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar15 * (int)auVar76._8_4_ | (uint)!bVar15 * auVar86._8_4_;
            bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar15 * (int)auVar76._12_4_ | (uint)!bVar15 * auVar86._12_4_;
            auVar119._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar86._16_4_;
            auVar119._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar86._20_4_;
            auVar119._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar86._24_4_;
            auVar119._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar86._28_4_;
            bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar63 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar63 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar63 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar86 = vsubps_avx512vl(auVar119,auVar95);
            auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar25._12_4_ |
                                                     (uint)!bVar19 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar18 * (int)auVar25._8_4_ |
                                                              (uint)!bVar18 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar25._4_4_ |
                                                                       (uint)!bVar15 * auVar22._4_4_
                                                                       ,(uint)(bVar61 & 1) *
                                                                        (int)auVar25._0_4_ |
                                                                        (uint)!(bool)(bVar61 & 1) *
                                                                        auVar22._0_4_)))),auVar87);
            auVar97 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar82._12_4_ |
                                                    (uint)!bVar20 * auVar75._12_4_,
                                                    CONCAT48((uint)bVar17 * (int)auVar82._8_4_ |
                                                             (uint)!bVar17 * auVar75._8_4_,
                                                             CONCAT44((uint)bVar16 *
                                                                      (int)auVar82._4_4_ |
                                                                      (uint)!bVar16 * auVar75._4_4_,
                                                                      (uint)(bVar61 & 1) *
                                                                      (int)auVar82._0_4_ |
                                                                      (uint)!(bool)(bVar61 & 1) *
                                                                      auVar75._0_4_)))),auVar115);
            auVar96 = vsubps_avx(auVar95,auVar116);
            auVar84 = vsubps_avx(auVar87,auVar117);
            auVar85 = vsubps_avx(auVar115,auVar118);
            auVar54._4_4_ = auVar97._4_4_ * fVar124;
            auVar54._0_4_ = auVar97._0_4_ * fVar122;
            auVar54._8_4_ = auVar97._8_4_ * fVar127;
            auVar54._12_4_ = auVar97._12_4_ * fVar128;
            auVar54._16_4_ = auVar97._16_4_ * 0.0;
            auVar54._20_4_ = auVar97._20_4_ * 0.0;
            auVar54._24_4_ = auVar97._24_4_ * 0.0;
            auVar54._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar54,auVar115,auVar86);
            auVar156._0_4_ = fVar123 * auVar86._0_4_;
            auVar156._4_4_ = fVar126 * auVar86._4_4_;
            auVar156._8_4_ = fVar125 * auVar86._8_4_;
            auVar156._12_4_ = fVar129 * auVar86._12_4_;
            auVar156._16_4_ = auVar86._16_4_ * 0.0;
            auVar156._20_4_ = auVar86._20_4_ * 0.0;
            auVar156._24_4_ = auVar86._24_4_ * 0.0;
            auVar156._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar156,auVar95,auVar100);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar93,ZEXT1632(auVar81));
            auVar161._0_4_ = auVar100._0_4_ * auVar115._0_4_;
            auVar161._4_4_ = auVar100._4_4_ * auVar115._4_4_;
            auVar161._8_4_ = auVar100._8_4_ * auVar115._8_4_;
            auVar161._12_4_ = auVar100._12_4_ * auVar115._12_4_;
            auVar161._16_4_ = auVar100._16_4_ * fVar135;
            auVar161._20_4_ = auVar100._20_4_ * fVar134;
            auVar161._24_4_ = auVar100._24_4_ * fVar167;
            auVar161._28_4_ = 0;
            auVar81 = vfmsub231ps_fma(auVar161,auVar87,auVar97);
            auVar88 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar81));
            auVar98 = vmulps_avx512vl(auVar85,auVar116);
            auVar98 = vfmsub231ps_avx512vl(auVar98,auVar96,auVar118);
            auVar55._4_4_ = auVar84._4_4_ * auVar118._4_4_;
            auVar55._0_4_ = auVar84._0_4_ * auVar118._0_4_;
            auVar55._8_4_ = auVar84._8_4_ * auVar118._8_4_;
            auVar55._12_4_ = auVar84._12_4_ * auVar118._12_4_;
            auVar55._16_4_ = auVar84._16_4_ * fVar72;
            auVar55._20_4_ = auVar84._20_4_ * fVar121;
            auVar55._24_4_ = auVar84._24_4_ * fVar71;
            auVar55._28_4_ = iVar2;
            auVar81 = vfmsub231ps_fma(auVar55,auVar117,auVar85);
            auVar162._0_4_ = auVar117._0_4_ * auVar96._0_4_;
            auVar162._4_4_ = auVar117._4_4_ * auVar96._4_4_;
            auVar162._8_4_ = auVar117._8_4_ * auVar96._8_4_;
            auVar162._12_4_ = auVar117._12_4_ * auVar96._12_4_;
            auVar162._16_4_ = fVar170 * auVar96._16_4_;
            auVar162._20_4_ = fVar176 * auVar96._20_4_;
            auVar162._24_4_ = fVar136 * auVar96._24_4_;
            auVar162._28_4_ = 0;
            auVar74 = vfmsub231ps_fma(auVar162,auVar84,auVar116);
            auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar74),auVar93,auVar98);
            auVar89 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar81));
            auVar98 = vmaxps_avx(auVar88,auVar89);
            uVar137 = vcmpps_avx512vl(auVar98,auVar93,2);
            bVar70 = bVar70 & (byte)uVar137;
            if (bVar70 != 0) {
              auVar56._4_4_ = auVar85._4_4_ * auVar100._4_4_;
              auVar56._0_4_ = auVar85._0_4_ * auVar100._0_4_;
              auVar56._8_4_ = auVar85._8_4_ * auVar100._8_4_;
              auVar56._12_4_ = auVar85._12_4_ * auVar100._12_4_;
              auVar56._16_4_ = auVar85._16_4_ * auVar100._16_4_;
              auVar56._20_4_ = auVar85._20_4_ * auVar100._20_4_;
              auVar56._24_4_ = auVar85._24_4_ * auVar100._24_4_;
              auVar56._28_4_ = auVar98._28_4_;
              auVar21 = vfmsub231ps_fma(auVar56,auVar84,auVar97);
              auVar57._4_4_ = auVar97._4_4_ * auVar96._4_4_;
              auVar57._0_4_ = auVar97._0_4_ * auVar96._0_4_;
              auVar57._8_4_ = auVar97._8_4_ * auVar96._8_4_;
              auVar57._12_4_ = auVar97._12_4_ * auVar96._12_4_;
              auVar57._16_4_ = auVar97._16_4_ * auVar96._16_4_;
              auVar57._20_4_ = auVar97._20_4_ * auVar96._20_4_;
              auVar57._24_4_ = auVar97._24_4_ * auVar96._24_4_;
              auVar57._28_4_ = auVar97._28_4_;
              auVar74 = vfmsub231ps_fma(auVar57,auVar86,auVar85);
              auVar58._4_4_ = auVar84._4_4_ * auVar86._4_4_;
              auVar58._0_4_ = auVar84._0_4_ * auVar86._0_4_;
              auVar58._8_4_ = auVar84._8_4_ * auVar86._8_4_;
              auVar58._12_4_ = auVar84._12_4_ * auVar86._12_4_;
              auVar58._16_4_ = auVar84._16_4_ * auVar86._16_4_;
              auVar58._20_4_ = auVar84._20_4_ * auVar86._20_4_;
              auVar58._24_4_ = auVar84._24_4_ * auVar86._24_4_;
              auVar58._28_4_ = auVar84._28_4_;
              auVar22 = vfmsub231ps_fma(auVar58,auVar96,auVar100);
              auVar81 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar74),ZEXT1632(auVar22));
              auVar98 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar21),auVar93);
              auVar100 = vrcp14ps_avx512vl(auVar98);
              auVar96 = auVar188._0_32_;
              auVar97 = vfnmadd213ps_avx512vl(auVar100,auVar98,auVar96);
              auVar81 = vfmadd132ps_fma(auVar97,auVar100,auVar100);
              auVar59._4_4_ = auVar22._4_4_ * auVar115._4_4_;
              auVar59._0_4_ = auVar22._0_4_ * auVar115._0_4_;
              auVar59._8_4_ = auVar22._8_4_ * auVar115._8_4_;
              auVar59._12_4_ = auVar22._12_4_ * auVar115._12_4_;
              auVar59._16_4_ = fVar135 * 0.0;
              auVar59._20_4_ = fVar134 * 0.0;
              auVar59._24_4_ = fVar167 * 0.0;
              auVar59._28_4_ = iVar1;
              auVar74 = vfmadd231ps_fma(auVar59,auVar87,ZEXT1632(auVar74));
              auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar95,ZEXT1632(auVar21));
              fVar134 = auVar81._0_4_;
              fVar135 = auVar81._4_4_;
              fVar136 = auVar81._8_4_;
              fVar176 = auVar81._12_4_;
              local_200 = ZEXT1632(CONCAT412(auVar74._12_4_ * fVar176,
                                             CONCAT48(auVar74._8_4_ * fVar136,
                                                      CONCAT44(auVar74._4_4_ * fVar135,
                                                               auVar74._0_4_ * fVar134))));
              uVar137 = vcmpps_avx512vl(local_200,local_2a0,0xd);
              fVar167 = ray->tfar;
              auVar35._4_4_ = fVar167;
              auVar35._0_4_ = fVar167;
              auVar35._8_4_ = fVar167;
              auVar35._12_4_ = fVar167;
              auVar35._16_4_ = fVar167;
              auVar35._20_4_ = fVar167;
              auVar35._24_4_ = fVar167;
              auVar35._28_4_ = fVar167;
              uVar27 = vcmpps_avx512vl(local_200,auVar35,2);
              bVar70 = (byte)uVar137 & (byte)uVar27 & bVar70;
              if (bVar70 != 0) {
                uVar137 = vcmpps_avx512vl(auVar98,auVar93,4);
                bVar70 = bVar70 & (byte)uVar137;
                auVar187 = ZEXT3264(auVar101);
                if (bVar70 != 0) {
                  fVar167 = auVar88._0_4_ * fVar134;
                  fVar170 = auVar88._4_4_ * fVar135;
                  auVar60._4_4_ = fVar170;
                  auVar60._0_4_ = fVar167;
                  fVar71 = auVar88._8_4_ * fVar136;
                  auVar60._8_4_ = fVar71;
                  fVar72 = auVar88._12_4_ * fVar176;
                  auVar60._12_4_ = fVar72;
                  fVar121 = auVar88._16_4_ * 0.0;
                  auVar60._16_4_ = fVar121;
                  fVar122 = auVar88._20_4_ * 0.0;
                  auVar60._20_4_ = fVar122;
                  fVar123 = auVar88._24_4_ * 0.0;
                  auVar60._24_4_ = fVar123;
                  auVar60._28_4_ = auVar98._28_4_;
                  auVar100 = vsubps_avx512vl(auVar96,auVar60);
                  local_240._0_4_ =
                       (float)((uint)(bVar61 & 1) * (int)fVar167 |
                              (uint)!(bool)(bVar61 & 1) * auVar100._0_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
                  local_240._4_4_ =
                       (float)((uint)bVar15 * (int)fVar170 | (uint)!bVar15 * auVar100._4_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
                  local_240._8_4_ =
                       (float)((uint)bVar15 * (int)fVar71 | (uint)!bVar15 * auVar100._8_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
                  local_240._12_4_ =
                       (float)((uint)bVar15 * (int)fVar72 | (uint)!bVar15 * auVar100._12_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
                  local_240._16_4_ =
                       (float)((uint)bVar15 * (int)fVar121 | (uint)!bVar15 * auVar100._16_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
                  local_240._20_4_ =
                       (float)((uint)bVar15 * (int)fVar122 | (uint)!bVar15 * auVar100._20_4_);
                  bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
                  local_240._24_4_ =
                       (float)((uint)bVar15 * (int)fVar123 | (uint)!bVar15 * auVar100._24_4_);
                  bVar15 = SUB81(uVar63 >> 7,0);
                  local_240._28_4_ =
                       (float)((uint)bVar15 * auVar98._28_4_ | (uint)!bVar15 * auVar100._28_4_);
                  auVar98 = vsubps_avx(ZEXT1632(auVar80),auVar90);
                  auVar81 = vfmadd213ps_fma(auVar98,local_240,auVar90);
                  fVar167 = local_508->depth_scale;
                  auVar36._4_4_ = fVar167;
                  auVar36._0_4_ = fVar167;
                  auVar36._8_4_ = fVar167;
                  auVar36._12_4_ = fVar167;
                  auVar36._16_4_ = fVar167;
                  auVar36._20_4_ = fVar167;
                  auVar36._24_4_ = fVar167;
                  auVar36._28_4_ = fVar167;
                  auVar98 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar81._12_4_ + auVar81._12_4_,
                                                               CONCAT48(auVar81._8_4_ +
                                                                        auVar81._8_4_,
                                                                        CONCAT44(auVar81._4_4_ +
                                                                                 auVar81._4_4_,
                                                                                 auVar81._0_4_ +
                                                                                 auVar81._0_4_)))),
                                            auVar36);
                  uVar137 = vcmpps_avx512vl(local_200,auVar98,6);
                  if (((byte)uVar137 & bVar70) != 0) {
                    auVar8._0_4_ = ray->tfar;
                    auVar8._4_4_ = ray->mask;
                    auVar8._8_4_ = ray->id;
                    auVar8._12_4_ = ray->flags;
                    uVar62 = vextractps_avx(auVar8,1);
                    auVar145._0_4_ = auVar89._0_4_ * fVar134;
                    auVar145._4_4_ = auVar89._4_4_ * fVar135;
                    auVar145._8_4_ = auVar89._8_4_ * fVar136;
                    auVar145._12_4_ = auVar89._12_4_ * fVar176;
                    auVar145._16_4_ = auVar89._16_4_ * 0.0;
                    auVar145._20_4_ = auVar89._20_4_ * 0.0;
                    auVar145._24_4_ = auVar89._24_4_ * 0.0;
                    auVar145._28_4_ = 0;
                    auVar98 = vsubps_avx512vl(auVar96,auVar145);
                    auVar120._0_4_ =
                         (uint)(bVar61 & 1) * (int)auVar145._0_4_ |
                         (uint)!(bool)(bVar61 & 1) * auVar98._0_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar120._4_4_ =
                         (uint)bVar15 * (int)auVar145._4_4_ | (uint)!bVar15 * auVar98._4_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar120._8_4_ =
                         (uint)bVar15 * (int)auVar145._8_4_ | (uint)!bVar15 * auVar98._8_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
                    auVar120._12_4_ =
                         (uint)bVar15 * (int)auVar145._12_4_ | (uint)!bVar15 * auVar98._12_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 4) & 1);
                    auVar120._16_4_ =
                         (uint)bVar15 * (int)auVar145._16_4_ | (uint)!bVar15 * auVar98._16_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 5) & 1);
                    auVar120._20_4_ =
                         (uint)bVar15 * (int)auVar145._20_4_ | (uint)!bVar15 * auVar98._20_4_;
                    bVar15 = (bool)((byte)(uVar63 >> 6) & 1);
                    auVar120._24_4_ =
                         (uint)bVar15 * (int)auVar145._24_4_ | (uint)!bVar15 * auVar98._24_4_;
                    auVar120._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar98._28_4_;
                    auVar37._8_4_ = 0x40000000;
                    auVar37._0_8_ = 0x4000000040000000;
                    auVar37._12_4_ = 0x40000000;
                    auVar37._16_4_ = 0x40000000;
                    auVar37._20_4_ = 0x40000000;
                    auVar37._24_4_ = 0x40000000;
                    auVar37._28_4_ = 0x40000000;
                    local_220 = vfmsub132ps_avx512vl(auVar120,auVar96,auVar37);
                    local_1e0 = (int)lVar66;
                    local_1dc = iVar10;
                    local_1d0 = local_460._0_8_;
                    uStack_1c8 = local_460._8_8_;
                    local_1c0 = local_470._0_8_;
                    uStack_1b8 = local_470._8_8_;
                    local_1b0 = local_480._0_8_;
                    uStack_1a8 = local_480._8_8_;
                    pGVar11 = (context->scene->geometries).items[local_510].ptr;
                    if ((pGVar11->mask & uVar62) == 0) {
                      bVar61 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar61 = 1, pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar81 = vcvtsi2ss_avx512f(auVar188._0_16_,(int)lVar66);
                      fVar167 = auVar81._0_4_;
                      local_180[0] = (fVar167 + local_240._0_4_ + 0.0) * (float)local_2c0._0_4_;
                      local_180[1] = (fVar167 + local_240._4_4_ + 1.0) * (float)local_2c0._4_4_;
                      local_180[2] = (fVar167 + local_240._8_4_ + 2.0) * fStack_2b8;
                      local_180[3] = (fVar167 + local_240._12_4_ + 3.0) * fStack_2b4;
                      fStack_170 = (fVar167 + local_240._16_4_ + 4.0) * fStack_2b0;
                      fStack_16c = (fVar167 + local_240._20_4_ + 5.0) * fStack_2ac;
                      fStack_168 = (fVar167 + local_240._24_4_ + 6.0) * fStack_2a8;
                      fStack_164 = fVar167 + local_240._28_4_ + 7.0;
                      local_160 = local_220;
                      local_140 = local_200;
                      uVar64 = CONCAT71(0,(byte)uVar137 & bVar70);
                      local_490._0_8_ = uVar64;
                      uVar63 = 0;
                      for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                        uVar63 = uVar63 + 1;
                      }
                      local_260 = auVar8;
                      local_4a0 = pGVar11;
                      do {
                        auVar74 = auVar189._0_16_;
                        local_4c4 = local_180[uVar63];
                        local_4c0 = *(undefined4 *)(local_160 + uVar63 * 4);
                        local_450 = uVar63;
                        ray->tfar = *(float *)(local_140 + uVar63 * 4);
                        local_500.context = context->user;
                        fVar134 = 1.0 - local_4c4;
                        fVar167 = fVar134 * fVar134 * -3.0;
                        auVar81 = vfmadd231ss_fma(ZEXT416((uint)(fVar134 * fVar134)),
                                                  ZEXT416((uint)(local_4c4 * fVar134)),
                                                  ZEXT416(0xc0000000));
                        auVar80 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar134)),
                                                  ZEXT416((uint)(local_4c4 * local_4c4)),
                                                  ZEXT416(0x40000000));
                        fVar134 = auVar81._0_4_ * 3.0;
                        fVar135 = auVar80._0_4_ * 3.0;
                        fVar136 = local_4c4 * local_4c4 * 3.0;
                        auVar166._0_4_ = fVar136 * (float)local_310._0_4_;
                        auVar166._4_4_ = fVar136 * (float)local_310._4_4_;
                        auVar166._8_4_ = fVar136 * fStack_308;
                        auVar166._12_4_ = fVar136 * fStack_304;
                        auVar151._4_4_ = fVar135;
                        auVar151._0_4_ = fVar135;
                        auVar151._8_4_ = fVar135;
                        auVar151._12_4_ = fVar135;
                        auVar81 = vfmadd132ps_fma(auVar151,auVar166,local_480);
                        auVar154._4_4_ = fVar134;
                        auVar154._0_4_ = fVar134;
                        auVar154._8_4_ = fVar134;
                        auVar154._12_4_ = fVar134;
                        auVar81 = vfmadd132ps_fma(auVar154,auVar81,local_470);
                        auVar152._4_4_ = fVar167;
                        auVar152._0_4_ = fVar167;
                        auVar152._8_4_ = fVar167;
                        auVar152._12_4_ = fVar167;
                        auVar81 = vfmadd132ps_fma(auVar152,auVar81,local_460);
                        local_4d0 = vmovlps_avx(auVar81);
                        local_4c8 = vextractps_avx(auVar81,2);
                        local_4bc = (int)local_498;
                        local_4b8 = (int)local_510;
                        local_4b4 = (local_500.context)->instID[0];
                        local_4b0 = (local_500.context)->instPrimID[0];
                        local_524 = -1;
                        local_500.valid = &local_524;
                        local_500.geometryUserPtr = local_4a0->userPtr;
                        local_500.ray = (RTCRayN *)ray;
                        local_500.hit = (RTCHitN *)&local_4d0;
                        local_500.N = 1;
                        if ((local_4a0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_4a0->occlusionFilterN)(&local_500), context = local_520,
                           *local_500.valid != 0)) {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 == (RTCFilterFunctionN)0x0) ||
                             ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_4a0->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var14)(&local_500), context = local_520, *local_500.valid != 0)))
                             ) {
                            bVar61 = 1;
                            auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar188 = ZEXT3264(auVar98);
                            auVar81 = vxorps_avx512vl(auVar74,auVar74);
                            auVar189 = ZEXT1664(auVar81);
                            auVar187 = ZEXT3264(local_3c0);
                            auVar190 = ZEXT3264(local_340);
                            auVar196 = ZEXT3264(local_3e0);
                            auVar192 = ZEXT3264(local_360);
                            auVar194 = ZEXT3264(local_400);
                            auVar193 = ZEXT3264(local_420);
                            auVar191 = ZEXT3264(local_380);
                            auVar195 = ZEXT3264(local_3a0);
                            ray = local_518;
                            break;
                          }
                        }
                        local_518->tfar = (float)local_260._0_4_;
                        uVar65 = local_490._0_8_ ^ 1L << (local_450 & 0x3f);
                        bVar61 = 0;
                        local_490._0_8_ = uVar65;
                        uVar63 = 0;
                        for (uVar64 = uVar65; (uVar64 & 1) == 0;
                            uVar64 = uVar64 >> 1 | 0x8000000000000000) {
                          uVar63 = uVar63 + 1;
                        }
                        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar188 = ZEXT3264(auVar98);
                        auVar81 = vxorps_avx512vl(auVar74,auVar74);
                        auVar189 = ZEXT1664(auVar81);
                        auVar187 = ZEXT3264(local_3c0);
                        auVar190 = ZEXT3264(local_340);
                        auVar196 = ZEXT3264(local_3e0);
                        auVar192 = ZEXT3264(local_360);
                        auVar194 = ZEXT3264(local_400);
                        auVar193 = ZEXT3264(local_420);
                        auVar191 = ZEXT3264(local_380);
                        auVar195 = ZEXT3264(local_3a0);
                        context = local_520;
                        ray = local_518;
                      } while (uVar65 != 0);
                    }
                    bVar68 = (bool)(bVar68 | bVar61);
                  }
                }
                goto LAB_01b7abf9;
              }
            }
            auVar187 = ZEXT3264(auVar101);
          }
LAB_01b7abf9:
          lVar66 = lVar66 + 8;
        } while ((int)lVar66 < iVar10);
      }
      if (bVar68) {
        return bVar68;
      }
      fVar167 = ray->tfar;
      auVar32._4_4_ = fVar167;
      auVar32._0_4_ = fVar167;
      auVar32._8_4_ = fVar167;
      auVar32._12_4_ = fVar167;
      uVar137 = vcmpps_avx512vl(local_250,auVar32,2);
      uVar62 = (uint)uVar69 & (uint)uVar69 + 0xf & (uint)uVar137;
      uVar69 = (ulong)uVar62;
    } while (uVar62 != 0);
  }
  return bVar68;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }